

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

bool embree::avx::InstanceArrayIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,Primitive *prim)

{
  RawBufferView *pRVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 uVar5;
  RTCFormat RVar6;
  InstanceArray *this;
  RawBufferView *pRVar7;
  RTCPointQueryContext *pRVar8;
  bool bVar9;
  undefined1 uVar10;
  Accel *pAVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  char *pcVar18;
  RawBufferView *pRVar19;
  uint uVar20;
  undefined4 uVar21;
  vfloat4 a0_1;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar69;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_ZMM1 [64];
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar106;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar104;
  float fVar105;
  undefined1 in_ZMM2 [64];
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar124;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar123;
  undefined1 in_ZMM3 [64];
  vfloat4 a0;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 in_ZMM4 [64];
  float fVar145;
  vfloat4 b0;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 in_ZMM5 [64];
  float fVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 in_ZMM6 [64];
  float fVar162;
  undefined1 auVar163 [16];
  float fVar167;
  undefined1 auVar164 [16];
  float fVar165;
  float fVar166;
  undefined1 in_ZMM7 [64];
  float fVar168;
  float fVar173;
  float fVar174;
  vfloat4 a1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar175;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar185 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar186 [16];
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined4 local_e0;
  float local_dc;
  float local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  Accel *local_98;
  undefined8 local_90;
  PointQuery *local_88;
  undefined4 local_80;
  undefined1 local_78 [16];
  float local_68;
  void *local_60;
  undefined8 local_58;
  undefined1 local_48 [16];
  undefined1 auVar94 [16];
  
  auVar60 = in_ZMM7._0_16_;
  auVar68 = in_ZMM6._0_16_;
  auVar183 = in_ZMM11._0_16_;
  auVar94 = in_ZMM15._0_16_;
  auVar185 = in_ZMM12._0_16_;
  auVar186 = in_ZMM13._0_16_;
  b0.field_0 = in_ZMM5._0_16_;
  a0.field_0 = in_ZMM4._0_16_;
  auVar41 = in_ZMM14._0_16_;
  auVar178 = in_ZMM9._0_16_;
  auVar93 = in_ZMM2._0_16_;
  auVar67 = in_ZMM1._0_16_;
  a0_1.field_0 = in_ZMM0._0_16_;
  auVar97 = in_ZMM3._0_16_;
  uVar14 = (ulong)prim->instID_;
  this = (InstanceArray *)(context->scene->geometries).items[uVar14].ptr;
  pAVar11 = InstanceArray::getObject(this,(ulong)prim->primID_);
  if (pAVar11 == (Accel *)0x0) {
    return false;
  }
  uVar12 = (ulong)prim->primID_;
  if ((this->super_Geometry).numTimeSteps == 1) {
    pRVar19 = (this->l2w_buf).items;
    RVar6 = pRVar19->format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar12 * pRVar19->stride;
        auVar94 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x10)),0x1c);
        auVar67 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x20)),0x28);
        auVar94 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x14)),0x1c);
        auVar97 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),0x28);
        auVar94 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),0x1c);
        auVar93 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x28)),0x28);
        auVar94 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x1c)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar94,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x2c)),0x28);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar12 * pRVar19->stride;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)(pcVar18 + lVar13 + 4);
        auVar94 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar37,0x4c);
        auVar67 = vshufps_avx(auVar94,auVar94,0x78);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar94 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),auVar38,0x4c);
        auVar97 = vshufps_avx(auVar94,auVar94,0x78);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar94 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar39,0x4c);
        auVar93 = vshufps_avx(auVar94,auVar94,0x78);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x28);
        auVar94 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),auVar40,0x4c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar94,auVar94,0x78);
      }
      else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar12 * pRVar19->stride;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar94 = vinsertps_avx(auVar49,ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),0x20);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x34);
        auVar67 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar50);
        auVar68 = vshufps_avx(auVar67,auVar50,0xd8);
        auVar137._8_8_ = 0;
        auVar137._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar67 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar137);
        auVar60 = vshufps_avx(auVar67,auVar137,0xd8);
        fVar69 = *(float *)(pcVar18 + lVar13 + 0x24);
        fVar107 = *(float *)(pcVar18 + lVar13 + 0x28);
        fVar122 = *(float *)(pcVar18 + lVar13 + 0x2c);
        fVar123 = *(float *)(pcVar18 + lVar13 + 0x30);
        fVar92 = fVar123 * fVar123 + fVar122 * fVar122 + fVar69 * fVar69 + fVar107 * fVar107;
        auVar67 = vrsqrtss_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92));
        fVar104 = auVar67._0_4_;
        fVar92 = fVar104 * 1.5 + fVar104 * fVar104 * fVar104 * fVar92 * -0.5;
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar60,ZEXT416((uint)(fVar92 * fVar69)),0x30);
        auVar67 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar92 * fVar107)),0x30);
        auVar68 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),0x10);
        auVar93 = vinsertps_avx(auVar94,ZEXT416((uint)(fVar92 * fVar123)),0x30);
        auVar94 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x3c)),0x20);
        auVar97 = vinsertps_avx(auVar94,ZEXT416((uint)(fVar92 * fVar122)),0x30);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar12 * pRVar19->stride;
        auVar67 = *(undefined1 (*) [16])(pcVar18 + lVar13);
        auVar97 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x10);
        auVar93 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x20);
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar18 + lVar13 + 0x30);
      }
      auVar94 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar68 = vshufps_avx(auVar67,auVar67,0xff);
      auVar60 = vshufps_avx(auVar97,auVar97,0xff);
      auVar183 = vshufps_avx(auVar93,auVar93,0xff);
      fVar165 = auVar68._0_4_;
      fVar162 = auVar94._0_4_;
      fVar106 = auVar60._0_4_;
      fVar124 = auVar183._0_4_;
      fVar69 = fVar165 * fVar106 + fVar124 * fVar162;
      fVar123 = fVar165 * fVar106 - fVar124 * fVar162;
      fVar92 = fVar162 * fVar162 - fVar165 * fVar165;
      fVar104 = fVar165 * fVar124 - fVar106 * fVar162;
      fVar107 = fVar165 * fVar124 + fVar106 * fVar162;
      fVar122 = fVar165 * fVar162 + fVar106 * fVar124;
      fVar105 = fVar106 * fVar124 - fVar165 * fVar162;
      auVar94 = ZEXT416((uint)(-fVar124 * fVar124 +
                              -fVar106 * fVar106 + fVar162 * fVar162 + fVar165 * fVar165));
      auVar94 = vshufps_avx(auVar94,auVar94,0);
      auVar68 = ZEXT416((uint)(fVar69 + fVar69));
      auVar68 = vshufps_avx(auVar68,auVar68,0);
      auVar60 = ZEXT416((uint)(fVar104 + fVar104));
      auVar60 = vshufps_avx(auVar60,auVar60,0);
      aVar130._0_4_ = auVar94._0_4_ * 1.0 + auVar68._0_4_ * 0.0 + auVar60._0_4_ * 0.0;
      aVar130._4_4_ = auVar94._4_4_ * 0.0 + auVar68._4_4_ * 1.0 + auVar60._4_4_ * 0.0;
      aVar130._8_4_ = auVar94._8_4_ * 0.0 + auVar68._8_4_ * 0.0 + auVar60._8_4_ * 1.0;
      aVar130._12_4_ = auVar94._12_4_ * 0.0 + auVar68._12_4_ * 0.0 + auVar60._12_4_ * 0.0;
      auVar94 = ZEXT416((uint)(-fVar124 * fVar124 + fVar106 * fVar106 + fVar92));
      auVar94 = vshufps_avx(auVar94,auVar94,0);
      auVar68 = ZEXT416((uint)(fVar122 + fVar122));
      auVar68 = vshufps_avx(auVar68,auVar68,0);
      auVar60 = ZEXT416((uint)(fVar123 + fVar123));
      auVar60 = vshufps_avx(auVar60,auVar60,0);
      b0.field_0._0_4_ = auVar60._0_4_ * 1.0 + auVar94._0_4_ * 0.0 + auVar68._0_4_ * 0.0;
      b0.field_0._4_4_ = auVar60._4_4_ * 0.0 + auVar94._4_4_ * 1.0 + auVar68._4_4_ * 0.0;
      b0.field_0._8_4_ = auVar60._8_4_ * 0.0 + auVar94._8_4_ * 0.0 + auVar68._8_4_ * 1.0;
      b0.field_0._12_4_ = auVar60._12_4_ * 0.0 + auVar94._12_4_ * 0.0 + auVar68._12_4_ * 0.0;
      auVar94 = ZEXT416((uint)(-fVar106 * fVar106 + fVar92 + fVar124 * fVar124));
      auVar68 = vshufps_avx(auVar94,auVar94,0);
      auVar94 = ZEXT416((uint)(fVar105 + fVar105));
      auVar60 = vshufps_avx(auVar94,auVar94,0);
      auVar94 = ZEXT416((uint)(fVar107 + fVar107));
      auVar183 = vshufps_avx(auVar94,auVar94,0);
      auVar94 = vshufps_avx(auVar67,ZEXT416(0) << 0x20,0xe9);
      auVar94 = vblendps_avx(auVar94,auVar97,4);
      fVar69 = auVar183._0_4_ * 1.0 + auVar60._0_4_ * 0.0 + auVar68._0_4_ * 0.0;
      fVar107 = auVar183._4_4_ * 0.0 + auVar60._4_4_ * 1.0 + auVar68._4_4_ * 0.0;
      fVar122 = auVar183._8_4_ * 0.0 + auVar60._8_4_ * 0.0 + auVar68._8_4_ * 1.0;
      fVar123 = auVar183._12_4_ * 0.0 + auVar60._12_4_ * 0.0 + auVar68._12_4_ * 0.0;
      auVar68._0_4_ = auVar94._0_4_ + 0.0;
      auVar68._4_4_ = auVar94._4_4_ + 0.0;
      auVar68._8_4_ = auVar94._8_4_ + 0.0;
      auVar68._12_4_ = auVar94._12_4_ + 0.0;
      auVar67 = vshufps_avx(auVar67,auVar67,0);
      auVar178._0_4_ = fVar69 * 0.0;
      auVar178._4_4_ = fVar107 * 0.0;
      auVar178._8_4_ = fVar122 * 0.0;
      auVar178._12_4_ = fVar123 * 0.0;
      auVar94._0_4_ = auVar67._0_4_ * aVar130._0_4_ + auVar178._0_4_ + b0.field_0._0_4_ * 0.0;
      auVar94._4_4_ = auVar67._4_4_ * aVar130._4_4_ + auVar178._4_4_ + b0.field_0._4_4_ * 0.0;
      auVar94._8_4_ = auVar67._8_4_ * aVar130._8_4_ + auVar178._8_4_ + b0.field_0._8_4_ * 0.0;
      auVar94._12_4_ = auVar67._12_4_ * aVar130._12_4_ + auVar178._12_4_ + b0.field_0._12_4_ * 0.0;
      auVar67 = vshufps_avx(auVar97,auVar97,0);
      auVar60 = vshufps_avx(auVar97,auVar97,0x55);
      auVar183._0_4_ =
           auVar67._0_4_ * aVar130._0_4_ + auVar178._0_4_ + auVar60._0_4_ * b0.field_0._0_4_;
      auVar183._4_4_ =
           auVar67._4_4_ * aVar130._4_4_ + auVar178._4_4_ + auVar60._4_4_ * b0.field_0._4_4_;
      auVar183._8_4_ =
           auVar67._8_4_ * aVar130._8_4_ + auVar178._8_4_ + auVar60._8_4_ * b0.field_0._8_4_;
      auVar183._12_4_ =
           auVar67._12_4_ * aVar130._12_4_ + auVar178._12_4_ + auVar60._12_4_ * b0.field_0._12_4_;
      auVar67 = vshufps_avx(auVar93,auVar93,0x55);
      auVar97 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar60._0_4_ = auVar97._0_4_ * fVar69;
      auVar60._4_4_ = auVar97._4_4_ * fVar107;
      auVar60._8_4_ = auVar97._8_4_ * fVar122;
      auVar60._12_4_ = auVar97._12_4_ * fVar123;
      auVar97 = vshufps_avx(auVar93,auVar93,0);
      auVar185._0_4_ =
           auVar97._0_4_ * aVar130._0_4_ + auVar67._0_4_ * b0.field_0._0_4_ + auVar60._0_4_;
      auVar185._4_4_ =
           auVar97._4_4_ * aVar130._4_4_ + auVar67._4_4_ * b0.field_0._4_4_ + auVar60._4_4_;
      auVar185._8_4_ =
           auVar97._8_4_ * aVar130._8_4_ + auVar67._8_4_ * b0.field_0._8_4_ + auVar60._8_4_;
      auVar185._12_4_ =
           auVar97._12_4_ * aVar130._12_4_ + auVar67._12_4_ * b0.field_0._12_4_ + auVar60._12_4_;
      auVar97 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
      auVar67 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
      auVar93._0_4_ = auVar67._0_4_ * b0.field_0._0_4_;
      auVar93._4_4_ = auVar67._4_4_ * b0.field_0._4_4_;
      auVar93._8_4_ = auVar67._8_4_ * b0.field_0._8_4_;
      auVar93._12_4_ = auVar67._12_4_ * b0.field_0._12_4_;
      auVar67._0_4_ = auVar93._0_4_ + auVar97._0_4_ * fVar69;
      auVar67._4_4_ = auVar93._4_4_ + auVar97._4_4_ * fVar107;
      auVar67._8_4_ = auVar93._8_4_ + auVar97._8_4_ * fVar122;
      auVar67._12_4_ = auVar93._12_4_ + auVar97._12_4_ * fVar123;
      auVar97 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0);
      a0_1.field_0._0_4_ = auVar97._0_4_ * aVar130._0_4_ + auVar67._0_4_;
      a0_1.field_0._4_4_ = auVar97._4_4_ * aVar130._4_4_ + auVar67._4_4_;
      a0_1.field_0._8_4_ = auVar97._8_4_ * aVar130._8_4_ + auVar67._8_4_;
      a0_1.field_0._12_4_ = auVar97._12_4_ * aVar130._12_4_ + auVar67._12_4_;
LAB_010a4144:
      auVar186._0_4_ = auVar68._0_4_ + a0_1.field_0._0_4_;
      auVar186._4_4_ = auVar68._4_4_ + a0_1.field_0._4_4_;
      auVar186._8_4_ = auVar68._8_4_ + a0_1.field_0._8_4_;
      auVar186._12_4_ = auVar68._12_4_ + a0_1.field_0._12_4_;
    }
    else {
      aVar130 = a0.field_0;
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar12 * pRVar19->stride;
        auVar67 = ZEXT416(*(uint *)(pcVar18 + lVar13 + 4));
        auVar93 = ZEXT416(*(uint *)(pcVar18 + lVar13 + 8));
        auVar94 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x10)),0x1c);
        auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x20)),0x28);
        auVar97 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x14)),0x1c);
        auVar183 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),0x28);
        auVar97 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),0x1c);
        auVar185 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x28)),0x28);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                     ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x1c)),0x1c);
        auVar186 = vinsertps_avx((undefined1  [16])a0_1.field_0,
                                 ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x2c)),0x28);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar12 * pRVar19->stride;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(pcVar18 + lVar13 + 4);
        auVar94 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar22,0x4c);
        auVar94 = vshufps_avx(auVar94,auVar94,0x78);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),auVar23,0x4c);
        auVar183 = vshufps_avx(auVar67,auVar67,0x78);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar24,0x4c);
        auVar185 = vshufps_avx(auVar67,auVar67,0x78);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x28);
        auVar67 = ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24));
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),auVar25,0x4c);
        auVar186 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x78);
      }
      else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar12 * pRVar19->stride;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar97 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),0x20);
        auVar71._8_8_ = 0;
        auVar71._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x34);
        auVar94 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar71);
        auVar67 = vshufps_avx(auVar94,auVar71,0xd8);
        auVar125._8_8_ = 0;
        auVar125._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar94 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar125);
        auVar183 = vshufps_avx(auVar94,auVar125,0xd8);
        fVar69 = *(float *)(pcVar18 + lVar13 + 0x24);
        fVar107 = *(float *)(pcVar18 + lVar13 + 0x28);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar107);
        fVar122 = *(float *)(pcVar18 + lVar13 + 0x2c);
        auVar68 = ZEXT416((uint)fVar122);
        fVar123 = *(float *)(pcVar18 + lVar13 + 0x30);
        auVar60 = ZEXT416((uint)fVar123);
        fVar92 = fVar123 * fVar123 + fVar122 * fVar122 + fVar69 * fVar69 + fVar107 * fVar107;
        auVar94 = vrsqrtss_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92));
        fVar104 = auVar94._0_4_;
        auVar178 = ZEXT416((uint)(fVar104 * fVar104));
        fVar92 = fVar104 * 1.5 + fVar104 * fVar104 * fVar104 * fVar92 * -0.5;
        auVar186 = vinsertps_avx(auVar183,ZEXT416((uint)(fVar92 * fVar69)),0x30);
        auVar94 = vinsertps_avx(auVar67,ZEXT416((uint)(fVar92 * fVar107)),0x30);
        auVar67 = ZEXT416((uint)(fVar92 * fVar122));
        auVar93 = ZEXT416((uint)(fVar92 * fVar123));
        auVar183 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),0x10);
        auVar185 = vinsertps_avx(auVar97,ZEXT416((uint)(fVar92 * fVar123)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar183,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x3c)),0x20);
        auVar183 = vinsertps_avx((undefined1  [16])a0_1.field_0,ZEXT416((uint)(fVar92 * fVar122)),
                                 0x30);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar92 * fVar69));
      }
      else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar12 * pRVar19->stride;
        auVar94 = *(undefined1 (*) [16])(pcVar18 + lVar13);
        auVar183 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x10);
        auVar185 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x20);
        auVar186 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x30);
      }
    }
  }
  else {
    fVar69 = (this->super_Geometry).fnumTimeSegments;
    fVar107 = (this->super_Geometry).time_range.lower;
    fVar122 = (this->super_Geometry).time_range.upper;
    auVar42 = ZEXT416((uint)fVar122);
    fVar107 = fVar69 * ((query->time - fVar107) / (fVar122 - fVar107));
    auVar67 = ZEXT416((uint)fVar107);
    auVar94 = vroundss_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),9);
    auVar97 = vminss_avx(auVar94,ZEXT416((uint)(fVar69 + -1.0)));
    auVar94 = ZEXT816(0) << 0x20;
    auVar93 = SUB6416(ZEXT864(0),0) << 0x20;
    auVar97 = vmaxss_avx(auVar94,auVar97);
    iVar15 = (int)auVar97._0_4_;
    lVar13 = CONCAT44((int)(uVar14 >> 0x20),iVar15);
    fVar107 = fVar107 - auVar97._0_4_;
    pRVar7 = (this->l2w_buf).items;
    pRVar19 = pRVar7 + lVar13;
    RVar6 = pRVar7[lVar13].format;
    auVar89 = ZEXT416((uint)fVar107);
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = pRVar19->stride * uVar12;
        auVar94 = ZEXT416(*(uint *)(pcVar18 + lVar13 + 8));
        auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x10)),0x1c);
        auVar183 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x20)),0x28);
        auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x14)),0x1c);
        auVar185 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),0x28);
        auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),0x1c);
        auVar41 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x28)),0x28);
        auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x1c)),0x1c);
        auVar186 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x2c)),0x28);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = pRVar19->stride * uVar12;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = *(ulong *)(pcVar18 + lVar13 + 4);
        auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar97,0x4c);
        auVar183 = vshufps_avx(auVar67,auVar67,0x78);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),auVar41,0x4c);
        auVar185 = vshufps_avx(auVar67,auVar67,0x78);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar42,0x4c);
        auVar41 = vshufps_avx(auVar67,auVar67,0x78);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x28);
        auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),auVar43,0x4c);
        auVar186 = vshufps_avx(auVar67,auVar67,0x78);
      }
      else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = pRVar19->stride * uVar12;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar67 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),0x20);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x34);
        auVar94 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar84);
        auVar68 = vshufps_avx(auVar94,auVar84,0xd8);
        auVar138._8_8_ = 0;
        auVar138._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar94 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar138);
        auVar60 = vshufps_avx(auVar94,auVar138,0xd8);
        fVar69 = *(float *)(pcVar18 + lVar13 + 0x24);
        fVar122 = *(float *)(pcVar18 + lVar13 + 0x28);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar122);
        fVar123 = *(float *)(pcVar18 + lVar13 + 0x2c);
        fVar92 = *(float *)(pcVar18 + lVar13 + 0x30);
        fVar104 = fVar92 * fVar92 + fVar123 * fVar123 + fVar69 * fVar69 + fVar122 * fVar122;
        auVar94 = vrsqrtss_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104));
        fVar105 = auVar94._0_4_;
        auVar178 = ZEXT416((uint)(fVar105 * fVar105));
        fVar104 = fVar105 * 1.5 + fVar105 * fVar105 * fVar105 * fVar104 * -0.5;
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     ZEXT416((uint)(fVar104 * fVar69));
        auVar186 = vinsertps_avx(auVar60,ZEXT416((uint)(fVar104 * fVar69)),0x30);
        auVar183 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar104 * fVar122)),0x30);
        auVar94 = ZEXT416((uint)(fVar104 * fVar92));
        auVar68 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),0x10);
        auVar41 = vinsertps_avx(auVar67,ZEXT416((uint)(fVar104 * fVar92)),0x30);
        auVar67 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x3c)),0x20);
        auVar185 = vinsertps_avx(auVar67,ZEXT416((uint)(fVar104 * fVar123)),0x30);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = pRVar19->stride * uVar12;
        auVar183 = *(undefined1 (*) [16])(pcVar18 + lVar13);
        auVar185 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x10);
        auVar41 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x20);
        auVar186 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x30);
      }
      pRVar19 = pRVar7 + (iVar15 + 1U);
      RVar6 = pRVar7[iVar15 + 1U].format;
      pcVar18 = (char *)0x0;
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar12 * pRVar19->stride;
        auVar94 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x10)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar94,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x20)),0x28);
        auVar94 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x14)),0x1c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar94,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),0x28);
        auVar94 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),0x1c);
        auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x28)),0x28);
        auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x1c)),0x1c);
        auVar178 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x2c)),0x28);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar12 * pRVar19->stride;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)(pcVar18 + lVar13 + 4);
        auVar94 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar55,0x4c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar94,auVar94,0x78);
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar94 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),auVar56,0x4c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar94,auVar94,0x78);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar94 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar57,0x4c);
        auVar94 = vshufps_avx(auVar94,auVar94,0x78);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x28);
        auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),auVar58,0x4c);
        auVar178 = vshufps_avx(auVar67,auVar67,0x78);
      }
      else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar12 * pRVar19->stride;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar94 = vinsertps_avx(auVar59,ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),0x20);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x34);
        auVar67 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar86);
        auVar68 = vshufps_avx(auVar67,auVar86,0xd8);
        auVar141._8_8_ = 0;
        auVar141._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar67 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar141);
        auVar60 = vshufps_avx(auVar67,auVar141,0xd8);
        fVar69 = *(float *)(pcVar18 + lVar13 + 0x24);
        fVar122 = *(float *)(pcVar18 + lVar13 + 0x28);
        fVar123 = *(float *)(pcVar18 + lVar13 + 0x2c);
        fVar92 = *(float *)(pcVar18 + lVar13 + 0x30);
        fVar104 = fVar92 * fVar92 + fVar123 * fVar123 + fVar69 * fVar69 + fVar122 * fVar122;
        auVar67 = vrsqrtss_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104));
        fVar105 = auVar67._0_4_;
        fVar104 = fVar105 * 1.5 + fVar105 * fVar105 * fVar105 * fVar104 * -0.5;
        auVar178 = vinsertps_avx(auVar60,ZEXT416((uint)(fVar104 * fVar69)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar68,ZEXT416((uint)(fVar104 * fVar122)),0x30);
        auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),0x10);
        auVar94 = vinsertps_avx(auVar94,ZEXT416((uint)(fVar104 * fVar92)),0x30);
        auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x3c)),0x20);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar67,ZEXT416((uint)(fVar104 * fVar123)),0x30);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar12 * pRVar19->stride;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar18 + lVar13))->v;
        b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar18 + lVar13 + 0x10))->
                      v;
        auVar94 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x20);
        auVar178 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x30);
      }
      uVar21 = (undefined4)((ulong)pcVar18 >> 0x20);
      auVar67 = vshufps_avx(auVar186,auVar186,0xff);
      auVar68 = vshufps_avx(auVar183,auVar183,0xff);
      auVar60 = vshufps_avx(auVar185,auVar185,0xff);
      auVar97 = vshufps_avx(auVar41,auVar41,0xff);
      auVar93 = vshufps_avx(auVar178,auVar178,0xff);
      auVar42 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar43 = vshufps_avx((undefined1  [16])b0.field_0,(undefined1  [16])b0.field_0,0xff);
      _local_258 = vshufps_avx(auVar94,auVar94,0xff);
      fVar122 = auVar68._0_4_;
      fVar123 = auVar67._0_4_;
      fVar104 = auVar60._0_4_;
      fVar92 = auVar97._0_4_;
      fVar69 = fVar92 * local_258._0_4_ +
               fVar104 * auVar43._0_4_ + auVar93._0_4_ * fVar123 + auVar42._0_4_ * fVar122;
      auVar88._0_4_ = -fVar69;
      auVar88._4_4_ = 0x80000000;
      auVar88._8_4_ = 0x80000000;
      auVar88._12_4_ = 0x80000000;
      auVar114._0_8_ = local_258 ^ 0x8000000080000000;
      auVar114._8_4_ = local_258._8_4_ ^ 0x80000000;
      auVar114._12_4_ = local_258._12_4_ ^ 0x80000000;
      if (fVar69 < auVar88._0_4_) {
        auVar181._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
        auVar181._8_4_ = auVar93._8_4_ ^ 0x80000000;
        auVar181._12_4_ = auVar93._12_4_ ^ 0x80000000;
        auVar171._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
        auVar171._8_4_ = auVar42._8_4_ ^ 0x80000000;
        auVar171._12_4_ = auVar42._12_4_ ^ 0x80000000;
        auVar93 = auVar181;
        auVar42 = auVar171;
        _local_258 = auVar114;
      }
      auVar100._8_4_ = 0x7fffffff;
      auVar100._0_8_ = 0x7fffffff7fffffff;
      auVar100._12_4_ = 0x7fffffff;
      auVar67 = vandps_avx(ZEXT416((uint)fVar69),auVar100);
      fVar106 = auVar67._0_4_;
      auVar115._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
      auVar115._8_4_ = auVar43._8_4_ ^ 0x80000000;
      auVar115._12_4_ = auVar43._12_4_ ^ 0x80000000;
      auVar68 = vcmpss_avx(ZEXT416((uint)fVar69),auVar88,1);
      auVar60 = vmaxss_avx(auVar88,ZEXT416((uint)fVar69));
      fVar105 = auVar60._0_4_;
      fVar69 = 1.0 - fVar106;
      if (fVar69 < 0.0) {
        fVar69 = sqrtf(fVar69);
      }
      else {
        auVar60 = vsqrtss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
        fVar69 = auVar60._0_4_;
      }
      auVar68 = vblendvps_avx(auVar43,auVar115,auVar68);
      auVar97 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(1.5707964 -
                                         fVar69 * (fVar106 * (fVar106 * (fVar106 * (fVar106 * (
                                                  fVar106 * -0.0043095737 + 0.0192803) + -0.04489909
                                                  ) + 0.08785567) + -0.21450998) + 1.5707952))));
      auVar116._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
      auVar116._8_4_ = auVar97._8_4_ ^ 0x80000000;
      auVar116._12_4_ = auVar97._12_4_ ^ 0x80000000;
      auVar60 = vcmpss_avx(ZEXT416((uint)fVar105),ZEXT816(0) << 0x40,1);
      auVar60 = vblendvps_avx(auVar97,auVar116,auVar60);
      auVar67 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar67,1);
      auVar143._8_4_ = 0x7fc00000;
      auVar143._0_8_ = 0x7fc000007fc00000;
      auVar143._12_4_ = 0x7fc00000;
      auVar67 = vblendvps_avx(ZEXT416((uint)(1.5707964 - auVar60._0_4_)),auVar143,auVar67);
      fVar124 = fVar107 * auVar67._0_4_;
      auVar67 = ZEXT416((uint)(fVar124 * 0.63661975));
      auVar67 = vroundss_avx(auVar67,auVar67,9);
      uVar20 = (uint)auVar67._0_4_;
      pRVar19 = (RawBufferView *)CONCAT44(uVar21,uVar20);
      fVar124 = fVar124 - auVar67._0_4_ * 1.5707964;
      fVar106 = fVar124 * fVar124;
      fVar69 = fVar106 * (fVar106 * (fVar106 * (fVar106 * (fVar106 * -2.5963018e-07 + 2.4756235e-05)
                                               + -0.001388833) + 0.04166664) + -0.5) + 1.0;
      fVar124 = fVar124 * (fVar106 * (fVar106 * (fVar106 * (fVar106 * (fVar106 * -2.5029328e-08 +
                                                                      2.7600126e-06) +
                                                           -0.00019842605) + 0.008333348) +
                                     -0.16666667) + 1.0);
      fVar106 = fVar69;
      if ((uVar20 & 1) != 0) {
        fVar106 = fVar124;
        fVar124 = fVar69;
      }
      if ((uVar20 & 3) - 1 < 2) {
        fVar106 = -fVar106;
      }
      fVar162 = fVar123 * fVar105 - auVar93._0_4_;
      fVar165 = fVar122 * fVar105 - auVar42._0_4_;
      fVar166 = fVar105 * fVar104 - auVar68._0_4_;
      fVar167 = fVar105 * fVar92 - (float)local_258._0_4_;
      fVar69 = fVar167 * fVar167 + fVar166 * fVar166 + fVar162 * fVar162 + fVar165 * fVar165;
      auVar67 = vrsqrtss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
      fVar145 = auVar67._0_4_;
      fVar69 = fVar145 * 1.5 + fVar145 * fVar145 * fVar145 * fVar69 * -0.5;
      if ((uVar20 & 3) < 2) {
        fVar124 = -fVar124;
      }
      fVar156 = 1.0 - fVar107;
      fVar153 = fVar123 * fVar156 + fVar107 * auVar93._0_4_;
      fVar154 = fVar122 * fVar156 + fVar107 * auVar42._0_4_;
      fVar155 = fVar156 * fVar104 + fVar107 * auVar68._0_4_;
      fVar107 = fVar92 * fVar156 + fVar107 * (float)local_258._0_4_;
      fVar145 = fVar107 * fVar107 + fVar155 * fVar155 + fVar153 * fVar153 + fVar154 * fVar154;
      auVar67 = vrsqrtss_avx(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145));
      fVar159 = auVar67._0_4_;
      fVar145 = fVar159 * 1.5 + fVar159 * fVar159 * fVar159 * fVar145 * -0.5;
      if (0.9995 < fVar105) {
        fVar153 = fVar153 * fVar145;
        fVar154 = fVar154 * fVar145;
        fVar155 = fVar155 * fVar145;
      }
      else {
        fVar153 = fVar106 * fVar123 + fVar69 * fVar162 * fVar124;
        fVar154 = fVar106 * fVar122 + fVar69 * fVar165 * fVar124;
        fVar155 = fVar104 * fVar106 + fVar69 * fVar166 * fVar124;
      }
      local_218 = auVar41._0_4_;
      fStack_214 = auVar41._4_4_;
      fStack_210 = auVar41._8_4_;
      fStack_20c = auVar41._12_4_;
      auVar67 = vcmpss_avx(SUB6416(ZEXT464(0x3f7fdf3b),0),ZEXT416((uint)fVar105),1);
      auVar67 = vblendvps_avx(ZEXT416((uint)(fVar92 * fVar106 + fVar69 * fVar167 * fVar124)),
                              ZEXT416((uint)(fVar145 * fVar107)),auVar67);
      auVar68 = vpermilps_avx(auVar89,0);
      local_148 = a0.field_0._0_4_;
      fStack_144 = a0.field_0._4_4_;
      fStack_140 = a0.field_0._8_4_;
      fStack_13c = a0.field_0._12_4_;
      fVar69 = auVar68._0_4_;
      fVar107 = auVar68._4_4_;
      fVar122 = auVar68._8_4_;
      fVar123 = auVar68._12_4_;
      auVar68 = vshufps_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),0);
      local_1e8 = auVar183._0_4_;
      fStack_1e4 = auVar183._4_4_;
      fStack_1e0 = auVar183._8_4_;
      fStack_1dc = auVar183._12_4_;
      fVar92 = auVar68._0_4_;
      fVar104 = auVar68._4_4_;
      fVar105 = auVar68._8_4_;
      fVar106 = auVar68._12_4_;
      local_248._4_4_ = fVar104 * fStack_1e4 + fVar107 * fStack_144;
      local_248._0_4_ = fVar92 * local_1e8 + fVar69 * local_148;
      fStack_240 = fVar105 * fStack_1e0 + fVar122 * fStack_140;
      fStack_23c = fVar106 * fStack_1dc + fVar123 * fStack_13c;
      local_f8 = b0.field_0._0_4_;
      fStack_f4 = b0.field_0._4_4_;
      fStack_f0 = b0.field_0._8_4_;
      fStack_ec = b0.field_0._12_4_;
      local_1f8 = auVar185._0_4_;
      fStack_1f4 = auVar185._4_4_;
      fStack_1f0 = auVar185._8_4_;
      fStack_1ec = auVar185._12_4_;
      auVar101._0_4_ = fVar92 * local_1f8 + fVar69 * local_f8;
      auVar101._4_4_ = fVar104 * fStack_1f4 + fVar107 * fStack_f4;
      auVar101._8_4_ = fVar105 * fStack_1f0 + fVar122 * fStack_f0;
      auVar101._12_4_ = fVar106 * fStack_1ec + fVar123 * fStack_ec;
      local_138 = auVar94._0_4_;
      fStack_134 = auVar94._4_4_;
      fStack_130 = auVar94._8_4_;
      fStack_12c = auVar94._12_4_;
      auVar89._0_4_ = local_218 * fVar92 + fVar69 * local_138;
      auVar89._4_4_ = fStack_214 * fVar104 + fVar107 * fStack_134;
      auVar89._8_4_ = fStack_210 * fVar105 + fVar122 * fStack_130;
      auVar89._12_4_ = fStack_20c * fVar106 + fVar123 * fStack_12c;
      local_108 = auVar178._0_4_;
      fStack_104 = auVar178._4_4_;
      fStack_100 = auVar178._8_4_;
      fStack_fc = auVar178._12_4_;
      local_208 = auVar186._0_4_;
      fStack_204 = auVar186._4_4_;
      fStack_200 = auVar186._8_4_;
      fStack_1fc = auVar186._12_4_;
      auVar117._0_4_ = fVar92 * local_208 + fVar69 * local_108;
      auVar117._4_4_ = fVar104 * fStack_204 + fVar107 * fStack_104;
      auVar117._8_4_ = fVar105 * fStack_200 + fVar122 * fStack_100;
      auVar117._12_4_ = fVar106 * fStack_1fc + fVar123 * fStack_fc;
      fVar106 = auVar67._0_4_;
      fVar69 = fVar154 * fVar155 + fVar106 * fVar153;
      fVar123 = fVar154 * fVar155 - fVar106 * fVar153;
      fVar92 = fVar153 * fVar153 - fVar154 * fVar154;
      fVar104 = fVar106 * fVar154 - fVar153 * fVar155;
      fVar107 = fVar106 * fVar154 + fVar153 * fVar155;
      fVar122 = fVar106 * fVar155 + fVar153 * fVar154;
      fVar105 = fVar106 * fVar155 - fVar153 * fVar154;
      auVar94 = ZEXT416((uint)(-fVar106 * fVar106 +
                              -fVar155 * fVar155 + fVar153 * fVar153 + fVar154 * fVar154));
      auVar94 = vshufps_avx(auVar94,auVar94,0);
      auVar67 = ZEXT416((uint)(fVar69 + fVar69));
      auVar67 = vshufps_avx(auVar67,auVar67,0);
      auVar68 = ZEXT416((uint)(fVar104 + fVar104));
      auVar68 = vshufps_avx(auVar68,auVar68,0);
      aVar130._0_4_ = auVar94._0_4_ * 1.0 + auVar67._0_4_ * 0.0 + auVar68._0_4_ * 0.0;
      aVar130._4_4_ = auVar94._4_4_ * 0.0 + auVar67._4_4_ * 1.0 + auVar68._4_4_ * 0.0;
      aVar130._8_4_ = auVar94._8_4_ * 0.0 + auVar67._8_4_ * 0.0 + auVar68._8_4_ * 1.0;
      aVar130._12_4_ = auVar94._12_4_ * 0.0 + auVar67._12_4_ * 0.0 + auVar68._12_4_ * 0.0;
      auVar94 = ZEXT416((uint)(-fVar106 * fVar106 + fVar155 * fVar155 + fVar92));
      auVar94 = vshufps_avx(auVar94,auVar94,0);
      auVar67 = ZEXT416((uint)(fVar122 + fVar122));
      auVar67 = vshufps_avx(auVar67,auVar67,0);
      auVar68 = ZEXT416((uint)(fVar123 + fVar123));
      auVar68 = vshufps_avx(auVar68,auVar68,0);
      b0.field_0._0_4_ = auVar68._0_4_ * 1.0 + auVar67._0_4_ * 0.0 + auVar94._0_4_ * 0.0;
      b0.field_0._4_4_ = auVar68._4_4_ * 0.0 + auVar67._4_4_ * 0.0 + auVar94._4_4_ * 1.0;
      b0.field_0._8_4_ = auVar68._8_4_ * 0.0 + auVar67._8_4_ * 1.0 + auVar94._8_4_ * 0.0;
      b0.field_0._12_4_ = auVar68._12_4_ * 0.0 + auVar67._12_4_ * 0.0 + auVar94._12_4_ * 0.0;
      auVar94 = ZEXT416((uint)(fVar106 * fVar106 + -fVar155 * fVar155 + fVar92));
      auVar67 = vshufps_avx(auVar94,auVar94,0);
      auVar94 = ZEXT416((uint)(fVar105 + fVar105));
      auVar68 = vshufps_avx(auVar94,auVar94,0);
      auVar94 = ZEXT416((uint)(fVar107 + fVar107));
      auVar60 = vshufps_avx(auVar94,auVar94,0);
      auVar94 = vshufps_avx(_local_248,ZEXT416(0) << 0x20,0xe9);
      auVar94 = vblendps_avx(auVar94,auVar101,4);
      fVar69 = auVar60._0_4_ * 1.0 + auVar68._0_4_ * 0.0 + auVar67._0_4_ * 0.0;
      fVar107 = auVar60._4_4_ * 0.0 + auVar68._4_4_ * 1.0 + auVar67._4_4_ * 0.0;
      fVar122 = auVar60._8_4_ * 0.0 + auVar68._8_4_ * 0.0 + auVar67._8_4_ * 1.0;
      fVar123 = auVar60._12_4_ * 0.0 + auVar68._12_4_ * 0.0 + auVar67._12_4_ * 0.0;
      auVar68._0_4_ = auVar94._0_4_ + 0.0;
      auVar68._4_4_ = auVar94._4_4_ + 0.0;
      auVar68._8_4_ = auVar94._8_4_ + 0.0;
      auVar68._12_4_ = auVar94._12_4_ + 0.0;
      auVar67 = vshufps_avx(_local_248,_local_248,0);
      auVar178._0_4_ = fVar69 * 0.0;
      auVar178._4_4_ = fVar107 * 0.0;
      auVar178._8_4_ = fVar122 * 0.0;
      auVar178._12_4_ = fVar123 * 0.0;
      auVar94._0_4_ = auVar67._0_4_ * aVar130._0_4_ + auVar178._0_4_ + b0.field_0._0_4_ * 0.0;
      auVar94._4_4_ = auVar67._4_4_ * aVar130._4_4_ + auVar178._4_4_ + b0.field_0._4_4_ * 0.0;
      auVar94._8_4_ = auVar67._8_4_ * aVar130._8_4_ + auVar178._8_4_ + b0.field_0._8_4_ * 0.0;
      auVar94._12_4_ = auVar67._12_4_ * aVar130._12_4_ + auVar178._12_4_ + b0.field_0._12_4_ * 0.0;
      auVar67 = vshufps_avx(auVar101,auVar101,0);
      auVar60 = vshufps_avx(auVar101,auVar101,0x55);
      auVar183._0_4_ =
           auVar67._0_4_ * aVar130._0_4_ + auVar178._0_4_ + auVar60._0_4_ * b0.field_0._0_4_;
      auVar183._4_4_ =
           auVar67._4_4_ * aVar130._4_4_ + auVar178._4_4_ + auVar60._4_4_ * b0.field_0._4_4_;
      auVar183._8_4_ =
           auVar67._8_4_ * aVar130._8_4_ + auVar178._8_4_ + auVar60._8_4_ * b0.field_0._8_4_;
      auVar183._12_4_ =
           auVar67._12_4_ * aVar130._12_4_ + auVar178._12_4_ + auVar60._12_4_ * b0.field_0._12_4_;
      auVar67 = vshufps_avx(auVar89,auVar89,0x55);
      auVar97 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar60._0_4_ = auVar97._0_4_ * fVar69;
      auVar60._4_4_ = auVar97._4_4_ * fVar107;
      auVar60._8_4_ = auVar97._8_4_ * fVar122;
      auVar60._12_4_ = auVar97._12_4_ * fVar123;
      auVar93._0_4_ = auVar67._0_4_ * b0.field_0._0_4_ + auVar60._0_4_;
      auVar93._4_4_ = auVar67._4_4_ * b0.field_0._4_4_ + auVar60._4_4_;
      auVar93._8_4_ = auVar67._8_4_ * b0.field_0._8_4_ + auVar60._8_4_;
      auVar93._12_4_ = auVar67._12_4_ * b0.field_0._12_4_ + auVar60._12_4_;
      auVar67 = vshufps_avx(auVar89,auVar89,0);
      auVar185._0_4_ = auVar67._0_4_ * aVar130._0_4_ + auVar93._0_4_;
      auVar185._4_4_ = auVar67._4_4_ * aVar130._4_4_ + auVar93._4_4_;
      auVar185._8_4_ = auVar67._8_4_ * aVar130._8_4_ + auVar93._8_4_;
      auVar185._12_4_ = auVar67._12_4_ * aVar130._12_4_ + auVar93._12_4_;
      auVar97 = vshufps_avx(auVar117,auVar117,0xaa);
      auVar41 = vshufps_avx(auVar117,auVar117,0x55);
      auVar186 = vshufps_avx(auVar117,auVar117,0);
      auVar67._0_4_ = auVar186._0_4_ * aVar130._0_4_;
      auVar67._4_4_ = auVar186._4_4_ * aVar130._4_4_;
      auVar67._8_4_ = auVar186._8_4_ * aVar130._8_4_;
      auVar67._12_4_ = auVar186._12_4_ * aVar130._12_4_;
      a0_1.field_0._0_4_ = auVar67._0_4_ + auVar41._0_4_ * b0.field_0._0_4_ + auVar97._0_4_ * fVar69
      ;
      a0_1.field_0._4_4_ =
           auVar67._4_4_ + auVar41._4_4_ * b0.field_0._4_4_ + auVar97._4_4_ * fVar107;
      a0_1.field_0._8_4_ =
           auVar67._8_4_ + auVar41._8_4_ * b0.field_0._8_4_ + auVar97._8_4_ * fVar122;
      a0_1.field_0._12_4_ =
           auVar67._12_4_ + auVar41._12_4_ * b0.field_0._12_4_ + auVar97._12_4_ * fVar123;
      goto LAB_010a4144;
    }
    if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = pRVar19->stride * uVar12;
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc));
      auVar94 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x10)),0x1c);
      auVar67 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x20)),0x28);
      auVar94 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x14)),0x1c);
      auVar97 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),0x28);
      auVar94 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),0x1c);
      auVar42 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x28)),0x28);
      auVar94 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x1c)),0x1c);
      auVar93 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x2c)),0x28);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = pRVar19->stride * uVar12;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)(pcVar18 + lVar13 + 4);
      auVar94 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar26,0x4c);
      auVar67 = vshufps_avx(auVar94,auVar94,0x78);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
      auVar94 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),auVar70,0x4c);
      auVar97 = vshufps_avx(auVar94,auVar94,0x78);
      auVar95._8_8_ = 0;
      auVar95._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
      auVar94 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar95,0x4c);
      auVar42 = vshufps_avx(auVar94,auVar94,0x78);
      auVar96._8_8_ = 0;
      auVar96._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x28);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24));
      auVar94 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),auVar96,0x4c);
      auVar93 = vshufps_avx(auVar94,auVar94,0x78);
    }
    else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = pRVar19->stride * uVar12;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
      auVar94 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),0x20);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x34);
      auVar67 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar29);
      auVar68 = vshufps_avx(auVar67,auVar29,0xd8);
      auVar126._8_8_ = 0;
      auVar126._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
      auVar67 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar126);
      auVar97 = vshufps_avx(auVar67,auVar126,0xd8);
      fVar69 = *(float *)(pcVar18 + lVar13 + 0x24);
      fVar122 = *(float *)(pcVar18 + lVar13 + 0x28);
      fVar123 = *(float *)(pcVar18 + lVar13 + 0x2c);
      fVar92 = *(float *)(pcVar18 + lVar13 + 0x30);
      auVar60 = ZEXT416((uint)fVar92);
      fVar104 = fVar92 * fVar92 + fVar123 * fVar123 + fVar69 * fVar69 + fVar122 * fVar122;
      auVar67 = vrsqrtss_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104));
      fVar105 = auVar67._0_4_;
      fVar104 = fVar105 * 1.5 + fVar105 * fVar105 * fVar105 * fVar104 * -0.5;
      auVar93 = vinsertps_avx(auVar97,ZEXT416((uint)(fVar104 * fVar69)),0x30);
      auVar67 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar104 * fVar122)),0x30);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar104 * fVar123))
      ;
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar104 * fVar92));
      auVar68 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),0x10);
      auVar42 = vinsertps_avx(auVar94,ZEXT416((uint)(fVar104 * fVar92)),0x30);
      auVar94 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x3c)),0x20);
      auVar97 = vinsertps_avx(auVar94,ZEXT416((uint)(fVar104 * fVar123)),0x30);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = pRVar19->stride * uVar12;
      auVar67 = *(undefined1 (*) [16])(pcVar18 + lVar13);
      auVar97 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x10);
      auVar42 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x20);
      auVar93 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x30);
    }
    pRVar1 = pRVar7 + (iVar15 + 1U);
    RVar6 = pRVar7[iVar15 + 1U].format;
    pRVar19 = (RawBufferView *)0x0;
    if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pRVar19 = (RawBufferView *)pRVar1->ptr_ofs;
      lVar13 = uVar12 * pRVar1->stride;
      auVar94 = vinsertps_avx(ZEXT416(*(uint *)((long)&pRVar19->ptr_ofs + lVar13)),
                              ZEXT416((uint)*(size_t *)((long)&pRVar19->stride + lVar13)),0x1c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar94,ZEXT416(*(RTCFormat *)((long)&pRVar19->format + lVar13)),
                                 0x28);
      auVar94 = vinsertps_avx(ZEXT416(*(uint *)((long)&pRVar19->ptr_ofs + lVar13 + 4)),
                              ZEXT416(*(uint *)((long)&pRVar19->stride + lVar13 + 4)),0x1c);
      auVar68 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)&pRVar19->modCounter + lVar13)),0x28);
      auVar94 = vinsertps_avx(ZEXT416(*(uint *)((long)&pRVar19->dptr_ofs + lVar13)),
                              ZEXT416((uint)*(size_t *)((long)&pRVar19->num + lVar13)),0x1c);
      auVar60 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(&pRVar19->modified + lVar13)),0x28);
      auVar94 = vinsertps_avx(ZEXT416(*(uint *)((long)&pRVar19->dptr_ofs + lVar13 + 4)),
                              ZEXT416(*(uint *)((long)&pRVar19->num + lVar13 + 4)),0x1c);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar94,ZEXT416((uint)*(int *)((long)&pRVar19->userData + lVar13)),
                                 0x28);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pRVar19 = (RawBufferView *)pRVar1->ptr_ofs;
      lVar13 = uVar12 * pRVar1->stride;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = *(ulong *)((long)&pRVar19->ptr_ofs + lVar13 + 4);
      auVar94 = vshufps_avx(ZEXT416(*(uint *)((long)&pRVar19->ptr_ofs + lVar13)),auVar127,0x4c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar94,auVar94,0x78);
      auVar146._8_8_ = 0;
      auVar146._0_8_ = *(size_t *)((long)&pRVar19->stride + lVar13);
      auVar94 = vshufps_avx(ZEXT416(*(uint *)((long)&pRVar19->dptr_ofs + lVar13 + 4)),auVar146,0x4c)
      ;
      auVar68 = vshufps_avx(auVar94,auVar94,0x78);
      auVar147._8_8_ = 0;
      auVar147._0_8_ = *(ulong *)((long)&pRVar19->num + lVar13 + 4);
      auVar94 = vshufps_avx(ZEXT416((uint)*(size_t *)((long)&pRVar19->num + lVar13)),auVar147,0x4c);
      auVar60 = vshufps_avx(auVar94,auVar94,0x78);
      auVar148._8_8_ = 0;
      auVar148._0_8_ = *(ulong *)(&pRVar19->modified + lVar13);
      auVar94 = vshufps_avx(ZEXT416(*(uint *)((long)&pRVar19->modCounter + lVar13)),auVar148,0x4c);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar94,auVar94,0x78);
    }
    else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pRVar19 = (RawBufferView *)pRVar1->ptr_ofs;
      lVar13 = uVar12 * pRVar1->stride;
      auVar128._8_8_ = 0;
      auVar128._0_8_ = *(size_t *)((long)&pRVar19->stride + lVar13);
      auVar94 = vinsertps_avx(auVar128,ZEXT416(*(uint *)((long)&pRVar19->dptr_ofs + lVar13)),0x20);
      auVar129._8_8_ = 0;
      auVar129._0_8_ = *(ulong *)((long)&(pRVar19->buffer).ptr + lVar13 + 4);
      auVar68 = vmovlhps_avx(ZEXT416(*(uint *)((long)&pRVar19->ptr_ofs + lVar13)),auVar129);
      auVar60 = vshufps_avx(auVar68,auVar129,0xd8);
      auVar169._8_8_ = 0;
      auVar169._0_8_ = *(ulong *)((long)&pRVar19->num + lVar13 + 4);
      auVar68 = vmovlhps_avx(ZEXT416((uint)*(size_t *)((long)&pRVar19->num + lVar13)),auVar169);
      auVar183 = vshufps_avx(auVar68,auVar169,0xd8);
      fVar69 = *(float *)((long)&pRVar19->modCounter + lVar13);
      fVar122 = *(float *)(&pRVar19->modified + lVar13);
      fVar123 = *(float *)((long)&pRVar19->userData + lVar13);
      fVar92 = *(float *)((long)&(pRVar19->buffer).ptr + lVar13);
      fVar104 = fVar92 * fVar92 + fVar123 * fVar123 + fVar69 * fVar69 + fVar122 * fVar122;
      auVar68 = vrsqrtss_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104));
      fVar105 = auVar68._0_4_;
      fVar104 = fVar105 * 1.5 + fVar105 * fVar105 * fVar105 * fVar104 * -0.5;
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar183,ZEXT416((uint)(fVar69 * fVar104)),0x30);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar60,ZEXT416((uint)(fVar122 * fVar104)),0x30);
      auVar68 = vinsertps_avx(ZEXT416(*(uint *)((long)&pRVar19->dptr_ofs + lVar13 + 4)),
                              ZEXT416(*(uint *)((long)&pRVar19->ptr_ofs + lVar13 + 4)),0x10);
      auVar60 = vinsertps_avx(auVar94,ZEXT416((uint)(fVar92 * fVar104)),0x30);
      auVar94 = vinsertps_avx(auVar68,ZEXT416(*(uint *)((long)&pRVar19[1].ptr_ofs + lVar13 + 4)),
                              0x20);
      auVar68 = vinsertps_avx(auVar94,ZEXT416((uint)(fVar123 * fVar104)),0x30);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pRVar19 = (RawBufferView *)pRVar1->ptr_ofs;
      lVar13 = uVar12 * pRVar1->stride;
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((long)&pRVar19->ptr_ofs + lVar13))->v;
      auVar68 = *(undefined1 (*) [16])((long)&pRVar19->stride + lVar13);
      auVar60 = *(undefined1 (*) [16])((long)&pRVar19->format + lVar13);
      b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((long)&(pRVar19->buffer).ptr + lVar13))->v;
    }
    auVar178 = vshufps_avx(auVar89,auVar89,0);
    fVar92 = auVar178._0_4_;
    aVar130._0_4_ = fVar92 * a0.field_0._0_4_;
    fVar104 = auVar178._4_4_;
    aVar130._4_4_ = fVar104 * a0.field_0._4_4_;
    fVar105 = auVar178._8_4_;
    aVar130._8_4_ = fVar105 * a0.field_0._8_4_;
    fVar106 = auVar178._12_4_;
    aVar130._12_4_ = fVar106 * a0.field_0._12_4_;
    auVar94 = vshufps_avx(ZEXT416((uint)(1.0 - fVar107)),ZEXT416((uint)(1.0 - fVar107)),0);
    fVar69 = auVar94._0_4_;
    fVar107 = auVar94._4_4_;
    fVar122 = auVar94._8_4_;
    fVar123 = auVar94._12_4_;
    auVar94._0_4_ = fVar69 * auVar67._0_4_ + aVar130._0_4_;
    auVar94._4_4_ = fVar107 * auVar67._4_4_ + aVar130._4_4_;
    auVar94._8_4_ = fVar122 * auVar67._8_4_ + aVar130._8_4_;
    auVar94._12_4_ = fVar123 * auVar67._12_4_ + aVar130._12_4_;
    auVar183._0_4_ = fVar69 * auVar97._0_4_ + fVar92 * auVar68._0_4_;
    auVar183._4_4_ = fVar107 * auVar97._4_4_ + fVar104 * auVar68._4_4_;
    auVar183._8_4_ = fVar122 * auVar97._8_4_ + fVar105 * auVar68._8_4_;
    auVar183._12_4_ = fVar123 * auVar97._12_4_ + fVar106 * auVar68._12_4_;
    auVar185._0_4_ = fVar69 * auVar42._0_4_ + fVar92 * auVar60._0_4_;
    auVar185._4_4_ = fVar107 * auVar42._4_4_ + fVar104 * auVar60._4_4_;
    auVar185._8_4_ = fVar122 * auVar42._8_4_ + fVar105 * auVar60._8_4_;
    auVar185._12_4_ = fVar123 * auVar42._12_4_ + fVar106 * auVar60._12_4_;
    a0_1.field_0._0_4_ = fVar92 * b0.field_0._0_4_;
    a0_1.field_0._4_4_ = fVar104 * b0.field_0._4_4_;
    a0_1.field_0._8_4_ = fVar105 * b0.field_0._8_4_;
    a0_1.field_0._12_4_ = fVar106 * b0.field_0._12_4_;
    auVar67._0_4_ = fVar69 * auVar93._0_4_;
    auVar67._4_4_ = fVar107 * auVar93._4_4_;
    auVar67._8_4_ = fVar122 * auVar93._8_4_;
    auVar67._12_4_ = fVar123 * auVar93._12_4_;
    auVar186._0_4_ = auVar67._0_4_ + a0_1.field_0._0_4_;
    auVar186._4_4_ = auVar67._4_4_ + a0_1.field_0._4_4_;
    auVar186._8_4_ = auVar67._8_4_ + a0_1.field_0._8_4_;
    auVar186._12_4_ = auVar67._12_4_ + a0_1.field_0._12_4_;
  }
  uVar14 = (ulong)prim->primID_;
  if ((this->super_Geometry).numTimeSteps == 1) {
    pRVar19 = (this->l2w_buf).items;
    RVar6 = pRVar19->format;
    if ((this->super_Geometry).field_8.field_0x1 != '\x01') {
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar14 * pRVar19->stride;
        auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x10)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x20)),0x28);
        auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x14)),0x1c);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),0x28);
        auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),0x1c);
        auVar93 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x28)),0x28);
        auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x1c)),0x1c);
        auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x2c)),0x28);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar14 * pRVar19->stride;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(pcVar18 + lVar13 + 4);
        auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar30,0x4c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar67,auVar67,0x78);
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),auVar72,0x4c);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar67,auVar67,0x78);
        auVar73._8_8_ = 0;
        auVar73._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar73,0x4c);
        auVar93 = vshufps_avx(auVar67,auVar67,0x78);
        auVar74._8_8_ = 0;
        auVar74._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x28);
        auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),auVar74,0x4c);
        auVar67 = vshufps_avx(auVar67,auVar67,0x78);
      }
      else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar14 * pRVar19->stride;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar68 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),0x20);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x34);
        auVar67 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar33);
        auVar60 = vshufps_avx(auVar67,auVar33,0xd8);
        auVar131._8_8_ = 0;
        auVar131._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar67 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar131);
        auVar97 = vshufps_avx(auVar67,auVar131,0xd8);
        fVar69 = *(float *)(pcVar18 + lVar13 + 0x24);
        fVar107 = *(float *)(pcVar18 + lVar13 + 0x28);
        fVar122 = *(float *)(pcVar18 + lVar13 + 0x2c);
        fVar123 = *(float *)(pcVar18 + lVar13 + 0x30);
        fVar92 = fVar123 * fVar123 + fVar122 * fVar122 + fVar69 * fVar69 + fVar107 * fVar107;
        auVar67 = vrsqrtss_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92));
        fVar104 = auVar67._0_4_;
        fVar92 = fVar104 * 1.5 + fVar104 * fVar104 * fVar104 * fVar92 * -0.5;
        auVar67 = vinsertps_avx(auVar97,ZEXT416((uint)(fVar92 * fVar69)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar60,ZEXT416((uint)(fVar92 * fVar107)),0x30);
        auVar60 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),0x10);
        auVar93 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar92 * fVar123)),0x30);
        auVar68 = vinsertps_avx(auVar60,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x3c)),0x20);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  vinsertps_avx(auVar68,ZEXT416((uint)(fVar92 * fVar122)),0x30);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar14 * pRVar19->stride;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar18 + lVar13))->v;
        aVar130 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                   ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar18 + lVar13 + 0x10))->v;
        auVar93 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x20);
        auVar67 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x30);
      }
      goto LAB_010a2638;
    }
    if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = uVar14 * pRVar19->stride;
      auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x10)),0x1c);
      auVar178 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x20)),0x28);
      auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x14)),0x1c);
      auVar68 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),0x28);
      auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),0x1c);
      auVar93 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x28)),0x28);
      auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x1c)),0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x2c)),0x28);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = uVar14 * pRVar19->stride;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)(pcVar18 + lVar13 + 4);
      auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar44,0x4c);
      auVar178 = vshufps_avx(auVar67,auVar67,0x78);
      auVar81._8_8_ = 0;
      auVar81._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
      auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),auVar81,0x4c);
      auVar68 = vshufps_avx(auVar67,auVar67,0x78);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
      auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar82,0x4c);
      auVar93 = vshufps_avx(auVar67,auVar67,0x78);
      auVar83._8_8_ = 0;
      auVar83._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x28);
      auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),auVar83,0x4c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar67,auVar67,0x78);
    }
    else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = uVar14 * pRVar19->stride;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
      auVar67 = vinsertps_avx(auVar52,ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),0x20);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x34);
      auVar68 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar53);
      auVar60 = vshufps_avx(auVar68,auVar53,0xd8);
      auVar139._8_8_ = 0;
      auVar139._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
      auVar68 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar139);
      auVar97 = vshufps_avx(auVar68,auVar139,0xd8);
      fVar69 = *(float *)(pcVar18 + lVar13 + 0x24);
      fVar107 = *(float *)(pcVar18 + lVar13 + 0x28);
      fVar122 = *(float *)(pcVar18 + lVar13 + 0x2c);
      fVar123 = *(float *)(pcVar18 + lVar13 + 0x30);
      fVar92 = fVar123 * fVar123 + fVar122 * fVar122 + fVar69 * fVar69 + fVar107 * fVar107;
      auVar68 = vrsqrtss_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92));
      fVar104 = auVar68._0_4_;
      fVar92 = fVar104 * 1.5 + fVar104 * fVar104 * fVar104 * fVar92 * -0.5;
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar97,ZEXT416((uint)(fVar92 * fVar69)),0x30);
      auVar178 = vinsertps_avx(auVar60,ZEXT416((uint)(fVar92 * fVar107)),0x30);
      auVar68 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),0x10);
      auVar93 = vinsertps_avx(auVar67,ZEXT416((uint)(fVar92 * fVar123)),0x30);
      auVar67 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x3c)),0x20);
      auVar68 = vinsertps_avx(auVar67,ZEXT416((uint)(fVar92 * fVar122)),0x30);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = uVar14 * pRVar19->stride;
      auVar178 = *(undefined1 (*) [16])(pcVar18 + lVar13);
      auVar68 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x10);
      auVar93 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x20);
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar18 + lVar13 + 0x30);
    }
    auVar67 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
    auVar60 = vshufps_avx(auVar178,auVar178,0xff);
    auVar97 = vshufps_avx(auVar68,auVar68,0xff);
    auVar41 = vshufps_avx(auVar93,auVar93,0xff);
    fVar124 = auVar60._0_4_;
    fVar106 = auVar67._0_4_;
    fVar165 = auVar97._0_4_;
    fVar166 = auVar41._0_4_;
    fVar69 = fVar124 * fVar165 + fVar106 * fVar166;
    fVar123 = fVar124 * fVar165 - fVar106 * fVar166;
    fVar92 = fVar106 * fVar106 - fVar124 * fVar124;
    fVar104 = fVar124 * fVar166 - fVar106 * fVar165;
    fVar107 = fVar124 * fVar166 + fVar106 * fVar165;
    fVar122 = fVar165 * fVar166 + fVar124 * fVar106;
    fVar105 = fVar165 * fVar166 - fVar124 * fVar106;
    auVar67 = ZEXT416((uint)(-fVar166 * fVar166 +
                            -fVar165 * fVar165 + fVar106 * fVar106 + fVar124 * fVar124));
    auVar67 = vshufps_avx(auVar67,auVar67,0);
    auVar60 = ZEXT416((uint)(fVar69 + fVar69));
    auVar60 = vshufps_avx(auVar60,auVar60,0);
    auVar97 = ZEXT416((uint)(fVar104 + fVar104));
    auVar97 = vshufps_avx(auVar97,auVar97,0);
    fVar104 = auVar60._0_4_ * 0.0 + auVar97._0_4_ * 0.0 + auVar67._0_4_ * 1.0;
    fVar106 = auVar60._4_4_ * 1.0 + auVar97._4_4_ * 0.0 + auVar67._4_4_ * 0.0;
    fVar124 = auVar60._8_4_ * 0.0 + auVar97._8_4_ * 1.0 + auVar67._8_4_ * 0.0;
    fVar162 = auVar60._12_4_ * 0.0 + auVar97._12_4_ * 0.0 + auVar67._12_4_ * 0.0;
    auVar67 = ZEXT416((uint)(-fVar166 * fVar166 + fVar165 * fVar165 + fVar92));
    auVar67 = vshufps_avx(auVar67,auVar67,0);
    auVar60 = ZEXT416((uint)(fVar122 + fVar122));
    auVar60 = vshufps_avx(auVar60,auVar60,0);
    auVar97 = ZEXT416((uint)(fVar123 + fVar123));
    auVar97 = vshufps_avx(auVar97,auVar97,0);
    fVar122 = auVar97._0_4_ * 1.0 + auVar67._0_4_ * 0.0 + auVar60._0_4_ * 0.0;
    fVar123 = auVar97._4_4_ * 0.0 + auVar67._4_4_ * 1.0 + auVar60._4_4_ * 0.0;
    fVar153 = auVar97._8_4_ * 0.0 + auVar67._8_4_ * 0.0 + auVar60._8_4_ * 1.0;
    fVar154 = auVar97._12_4_ * 0.0 + auVar67._12_4_ * 0.0 + auVar60._12_4_ * 0.0;
    auVar67 = ZEXT416((uint)(-fVar165 * fVar165 + fVar92 + fVar166 * fVar166));
    auVar60 = vshufps_avx(auVar67,auVar67,0);
    auVar67 = ZEXT416((uint)(fVar105 + fVar105));
    auVar97 = vshufps_avx(auVar67,auVar67,0);
    auVar67 = ZEXT416((uint)(fVar107 + fVar107));
    auVar41 = vshufps_avx(auVar67,auVar67,0);
    auVar67 = vshufps_avx(auVar178,ZEXT416(0) << 0x20,0xe9);
    auVar67 = vblendps_avx(auVar67,auVar68,4);
    fVar107 = auVar41._0_4_ * 1.0 + auVar97._0_4_ * 0.0 + auVar60._0_4_ * 0.0;
    fVar92 = auVar41._4_4_ * 0.0 + auVar97._4_4_ * 1.0 + auVar60._4_4_ * 0.0;
    fVar165 = auVar41._8_4_ * 0.0 + auVar97._8_4_ * 0.0 + auVar60._8_4_ * 1.0;
    fVar166 = auVar41._12_4_ * 0.0 + auVar97._12_4_ * 0.0 + auVar60._12_4_ * 0.0;
    fVar105 = auVar67._0_4_;
    fVar167 = auVar67._4_4_;
    fVar145 = auVar67._8_4_;
    fVar69 = auVar67._12_4_;
    auVar67 = vshufps_avx(auVar178,auVar178,0);
    aVar61._0_4_ = auVar67._0_4_ * fVar104 + fVar107 * 0.0 + fVar122 * 0.0;
    aVar61._4_4_ = auVar67._4_4_ * fVar106 + fVar92 * 0.0 + fVar123 * 0.0;
    aVar61._8_4_ = auVar67._8_4_ * fVar124 + fVar165 * 0.0 + fVar153 * 0.0;
    aVar61._12_4_ = auVar67._12_4_ * fVar162 + fVar166 * 0.0 + fVar154 * 0.0;
    auVar67 = vshufps_avx(auVar68,auVar68,0);
    auVar68 = vshufps_avx(auVar68,auVar68,0x55);
    aVar130._0_4_ = auVar67._0_4_ * fVar104 + fVar107 * 0.0 + auVar68._0_4_ * fVar122;
    aVar130._4_4_ = auVar67._4_4_ * fVar106 + fVar92 * 0.0 + auVar68._4_4_ * fVar123;
    aVar130._8_4_ = auVar67._8_4_ * fVar124 + fVar165 * 0.0 + auVar68._8_4_ * fVar153;
    aVar130._12_4_ = auVar67._12_4_ * fVar162 + fVar166 * 0.0 + auVar68._12_4_ * fVar154;
    auVar67 = vshufps_avx(auVar93,auVar93,0x55);
    auVar68 = vshufps_avx(auVar93,auVar93,0xaa);
    auVar60 = vshufps_avx(auVar93,auVar93,0);
    auVar93._0_4_ = auVar60._0_4_ * fVar104 + auVar68._0_4_ * fVar107 + auVar67._0_4_ * fVar122;
    auVar93._4_4_ = auVar60._4_4_ * fVar106 + auVar68._4_4_ * fVar92 + auVar67._4_4_ * fVar123;
    auVar93._8_4_ = auVar60._8_4_ * fVar124 + auVar68._8_4_ * fVar165 + auVar67._8_4_ * fVar153;
    auVar93._12_4_ = auVar60._12_4_ * fVar162 + auVar68._12_4_ * fVar166 + auVar67._12_4_ * fVar154;
    auVar67 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
    auVar68 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
    fVar107 = auVar68._0_4_ * fVar122 + auVar67._0_4_ * fVar107;
    fVar122 = auVar68._4_4_ * fVar123 + auVar67._4_4_ * fVar92;
    fVar123 = auVar68._8_4_ * fVar153 + auVar67._8_4_ * fVar165;
    fVar92 = auVar68._12_4_ * fVar154 + auVar67._12_4_ * fVar166;
    auVar68 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0);
    a0_1.field_0 = aVar61;
  }
  else {
    fVar69 = (this->super_Geometry).fnumTimeSegments;
    fVar107 = (this->super_Geometry).time_range.lower;
    fVar122 = (this->super_Geometry).time_range.upper;
    auVar41 = ZEXT416((uint)fVar122);
    fVar107 = fVar69 * ((query->time - fVar107) / (fVar122 - fVar107));
    auVar67 = ZEXT416((uint)fVar107);
    auVar97 = vroundss_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),9);
    auVar93 = vminss_avx(auVar97,ZEXT416((uint)(fVar69 + -1.0)));
    auVar89 = ZEXT816(0) << 0x20;
    auVar97 = SUB6416(ZEXT864(0),0) << 0x20;
    auVar42 = vmaxss_avx(auVar89,auVar93);
    iVar15 = (int)auVar42._0_4_;
    lVar13 = CONCAT44((int)((ulong)pRVar19 >> 0x20),iVar15);
    fVar107 = fVar107 - auVar42._0_4_;
    auVar93 = ZEXT416((uint)fVar107);
    pRVar7 = (this->l2w_buf).items;
    pRVar19 = pRVar7 + lVar13;
    RVar6 = pRVar7[lVar13].format;
    if ((this->super_Geometry).field_8.field_0x1 != '\x01') {
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = pRVar19->stride * uVar14;
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc));
        auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x10)),0x1c);
        auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x20)),0x28);
        auVar97 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x14)),0x1c);
        auVar97 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),0x28);
        auVar41 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),0x1c);
        auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x28)),0x28);
        auVar93 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x1c)),0x1c);
        auVar42 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x2c)),0x28);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = pRVar19->stride * uVar14;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)(pcVar18 + lVar13 + 4);
        auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar31,0x4c);
        auVar67 = vshufps_avx(auVar67,auVar67,0x78);
        auVar75._8_8_ = 0;
        auVar75._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar97 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),auVar75,0x4c);
        auVar97 = vshufps_avx(auVar97,auVar97,0x78);
        auVar76._8_8_ = 0;
        auVar76._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar41 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar76,0x4c);
        auVar41 = vshufps_avx(auVar41,auVar41,0x78);
        auVar77._8_8_ = 0;
        auVar77._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x28);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24));
        auVar93 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),auVar77,0x4c);
        auVar42 = vshufps_avx(auVar93,auVar93,0x78);
      }
      else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = pRVar19->stride * uVar14;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar97 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),0x20);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x34);
        auVar67 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar35);
        auVar68 = vshufps_avx(auVar67,auVar35,0xd8);
        auVar132._8_8_ = 0;
        auVar132._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar67 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar132);
        auVar41 = vshufps_avx(auVar67,auVar132,0xd8);
        fVar69 = *(float *)(pcVar18 + lVar13 + 0x24);
        fVar122 = *(float *)(pcVar18 + lVar13 + 0x28);
        fVar123 = *(float *)(pcVar18 + lVar13 + 0x2c);
        fVar92 = *(float *)(pcVar18 + lVar13 + 0x30);
        auVar60 = ZEXT416((uint)fVar92);
        fVar104 = fVar92 * fVar92 + fVar123 * fVar123 + fVar69 * fVar69 + fVar122 * fVar122;
        auVar67 = vrsqrtss_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104));
        fVar105 = auVar67._0_4_;
        fVar104 = fVar105 * 1.5 + fVar105 * fVar105 * fVar105 * fVar104 * -0.5;
        auVar42 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar104 * fVar69)),0x30);
        auVar67 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar104 * fVar122)),0x30);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar104 * fVar123));
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     ZEXT416((uint)(fVar104 * fVar92));
        auVar68 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),0x10);
        auVar41 = vinsertps_avx(auVar97,ZEXT416((uint)(fVar104 * fVar92)),0x30);
        auVar97 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x3c)),0x20);
        auVar97 = vinsertps_avx(auVar97,ZEXT416((uint)(fVar104 * fVar123)),0x30);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = pRVar19->stride * uVar14;
        auVar67 = *(undefined1 (*) [16])(pcVar18 + lVar13);
        auVar97 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x10);
        auVar41 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x20);
        auVar42 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x30);
      }
      pRVar19 = pRVar7 + (iVar15 + 1U);
      RVar6 = pRVar7[iVar15 + 1U].format;
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar14 * pRVar19->stride;
        auVar68 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x10)),0x1c);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  vinsertps_avx(auVar68,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x20)),0x28);
        auVar68 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x14)),0x1c);
        auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),0x28);
        auVar60 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),0x1c);
        auVar60 = vinsertps_avx(auVar60,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x28)),0x28);
        auVar93 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x1c)),0x1c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar93,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x2c)),0x28);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar14 * pRVar19->stride;
        auVar133._8_8_ = 0;
        auVar133._0_8_ = *(ulong *)(pcVar18 + lVar13 + 4);
        auVar68 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar133,0x4c);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar68,auVar68,0x78);
        auVar149._8_8_ = 0;
        auVar149._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar68 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),auVar149,0x4c);
        auVar68 = vshufps_avx(auVar68,auVar68,0x78);
        auVar150._8_8_ = 0;
        auVar150._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar60 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar150,0x4c);
        auVar60 = vshufps_avx(auVar60,auVar60,0x78);
        auVar151._8_8_ = 0;
        auVar151._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x28);
        auVar93 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),auVar151,0x4c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar93,auVar93,0x78);
      }
      else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar14 * pRVar19->stride;
        auVar134._8_8_ = 0;
        auVar134._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
        auVar68 = vinsertps_avx(auVar134,ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),0x20);
        auVar135._8_8_ = 0;
        auVar135._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x34);
        auVar60 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar135);
        auVar93 = vshufps_avx(auVar60,auVar135,0xd8);
        auVar170._8_8_ = 0;
        auVar170._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
        auVar60 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar170);
        auVar178 = vshufps_avx(auVar60,auVar170,0xd8);
        fVar69 = *(float *)(pcVar18 + lVar13 + 0x24);
        fVar122 = *(float *)(pcVar18 + lVar13 + 0x28);
        fVar123 = *(float *)(pcVar18 + lVar13 + 0x2c);
        fVar92 = *(float *)(pcVar18 + lVar13 + 0x30);
        fVar104 = fVar92 * fVar92 + fVar123 * fVar123 + fVar69 * fVar69 + fVar122 * fVar122;
        auVar60 = vrsqrtss_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104));
        fVar105 = auVar60._0_4_;
        fVar104 = fVar105 * 1.5 + fVar105 * fVar105 * fVar105 * fVar104 * -0.5;
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar178,ZEXT416((uint)(fVar69 * fVar104)),0x30);
        aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  vinsertps_avx(auVar93,ZEXT416((uint)(fVar122 * fVar104)),0x30);
        auVar93 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                                ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),0x10);
        auVar60 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar92 * fVar104)),0x30);
        auVar68 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x3c)),0x20);
        auVar68 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar123 * fVar104)),0x30);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = uVar14 * pRVar19->stride;
        aVar130 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                   ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar18 + lVar13))->v;
        auVar68 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x10);
        auVar60 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x20);
        b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar18 + lVar13 + 0x30))->
                      v;
      }
      auVar93 = vshufps_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),0);
      fVar92 = auVar93._0_4_;
      fVar104 = auVar93._4_4_;
      fVar105 = auVar93._8_4_;
      fVar106 = auVar93._12_4_;
      auVar93 = vshufps_avx(ZEXT416((uint)(1.0 - fVar107)),ZEXT416((uint)(1.0 - fVar107)),0);
      fVar69 = auVar93._0_4_;
      fVar107 = auVar93._4_4_;
      fVar122 = auVar93._8_4_;
      fVar123 = auVar93._12_4_;
      a0_1.field_0._0_4_ = fVar69 * auVar67._0_4_ + fVar92 * aVar130.v[0];
      a0_1.field_0._4_4_ = fVar107 * auVar67._4_4_ + fVar104 * aVar130.v[1];
      a0_1.field_0._8_4_ = fVar122 * auVar67._8_4_ + fVar105 * aVar130.v[2];
      a0_1.field_0._12_4_ = fVar123 * auVar67._12_4_ + fVar106 * aVar130.v[3];
      aVar130._0_4_ = fVar69 * auVar97._0_4_ + fVar92 * auVar68._0_4_;
      aVar130._4_4_ = fVar107 * auVar97._4_4_ + fVar104 * auVar68._4_4_;
      aVar130._8_4_ = fVar122 * auVar97._8_4_ + fVar105 * auVar68._8_4_;
      aVar130._12_4_ = fVar123 * auVar97._12_4_ + fVar106 * auVar68._12_4_;
      auVar93._0_4_ = fVar69 * auVar41._0_4_ + fVar92 * auVar60._0_4_;
      auVar93._4_4_ = fVar107 * auVar41._4_4_ + fVar104 * auVar60._4_4_;
      auVar93._8_4_ = fVar122 * auVar41._8_4_ + fVar105 * auVar60._8_4_;
      auVar93._12_4_ = fVar123 * auVar41._12_4_ + fVar106 * auVar60._12_4_;
      auVar67._0_4_ = fVar69 * auVar42._0_4_ + fVar92 * b0.field_0._0_4_;
      auVar67._4_4_ = fVar107 * auVar42._4_4_ + fVar104 * b0.field_0._4_4_;
      auVar67._8_4_ = fVar122 * auVar42._8_4_ + fVar105 * b0.field_0._8_4_;
      auVar67._12_4_ = fVar123 * auVar42._12_4_ + fVar106 * b0.field_0._12_4_;
      goto LAB_010a2638;
    }
    if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = pRVar19->stride * uVar14;
      auVar89 = ZEXT416(*(uint *)(pcVar18 + lVar13 + 8));
      auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x10)),0x1c);
      auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x20)),0x28);
      auVar68 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x14)),0x1c);
      auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),0x28);
      auVar60 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),0x1c);
      auVar93 = vinsertps_avx(auVar60,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x28)),0x28);
      auVar60 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x1c)),0x1c);
      auVar60 = vinsertps_avx(auVar60,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x2c)),0x28);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = pRVar19->stride * uVar14;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)(pcVar18 + lVar13 + 4);
      auVar67 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar45,0x4c);
      auVar67 = vshufps_avx(auVar67,auVar67,0x78);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
      auVar68 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),auVar46,0x4c);
      auVar68 = vshufps_avx(auVar68,auVar68,0x78);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
      auVar60 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar47,0x4c);
      auVar93 = vshufps_avx(auVar60,auVar60,0x78);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x28);
      auVar60 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),auVar48,0x4c);
      auVar60 = vshufps_avx(auVar60,auVar60,0x78);
    }
    else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = pRVar19->stride * uVar14;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
      auVar68 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),0x20);
      auVar85._8_8_ = 0;
      auVar85._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x34);
      auVar67 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar85);
      auVar97 = vshufps_avx(auVar67,auVar85,0xd8);
      auVar140._8_8_ = 0;
      auVar140._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
      auVar67 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar140);
      auVar60 = vshufps_avx(auVar67,auVar140,0xd8);
      fVar69 = *(float *)(pcVar18 + lVar13 + 0x24);
      fVar122 = *(float *)(pcVar18 + lVar13 + 0x28);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar122);
      fVar123 = *(float *)(pcVar18 + lVar13 + 0x2c);
      fVar92 = *(float *)(pcVar18 + lVar13 + 0x30);
      fVar104 = fVar92 * fVar92 + fVar123 * fVar123 + fVar69 * fVar69 + fVar122 * fVar122;
      auVar67 = vrsqrtss_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104));
      fVar105 = auVar67._0_4_;
      auVar178 = ZEXT416((uint)(fVar105 * fVar105));
      fVar104 = fVar105 * 1.5 + fVar105 * fVar105 * fVar105 * fVar104 * -0.5;
      aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar104 * fVar69));
      auVar60 = vinsertps_avx(auVar60,ZEXT416((uint)(fVar104 * fVar69)),0x30);
      auVar67 = vinsertps_avx(auVar97,ZEXT416((uint)(fVar104 * fVar122)),0x30);
      auVar89 = ZEXT416((uint)(fVar104 * fVar92));
      auVar97 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),0x10);
      auVar93 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar104 * fVar92)),0x30);
      auVar68 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x3c)),0x20);
      auVar68 = vinsertps_avx(auVar68,ZEXT416((uint)(fVar104 * fVar123)),0x30);
    }
    else {
      auVar67 = auVar183;
      auVar60 = auVar185;
      auVar68 = auVar186;
      if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar18 = pRVar19->ptr_ofs;
        lVar13 = pRVar19->stride * uVar14;
        auVar67 = *(undefined1 (*) [16])(pcVar18 + lVar13);
        auVar68 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x10);
        auVar93 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x20);
        auVar60 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x30);
      }
    }
    pRVar19 = pRVar7 + (iVar15 + 1U);
    RVar6 = pRVar7[iVar15 + 1U].format;
    if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = uVar14 * pRVar19->stride;
      auVar97 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x10)),0x1c);
      aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                vinsertps_avx(auVar97,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x20)),0x28);
      auVar97 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x14)),0x1c);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar97,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),0x28);
      auVar97 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),0x1c);
      auVar89 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x28)),0x28);
      auVar97 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x1c)),0x1c);
      auVar178 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x2c)),0x28);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = uVar14 * pRVar19->stride;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = *(ulong *)(pcVar18 + lVar13 + 4);
      auVar97 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar62,0x4c);
      aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar97,auVar97,0x78);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
      auVar97 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),auVar63,0x4c);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar97,auVar97,0x78);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
      auVar97 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar64,0x4c);
      auVar89 = vshufps_avx(auVar97,auVar97,0x78);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x28);
      auVar97 = vshufps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x24)),auVar65,0x4c);
      auVar178 = vshufps_avx(auVar97,auVar97,0x78);
    }
    else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = uVar14 * pRVar19->stride;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x10);
      auVar97 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(pcVar18 + lVar13 + 8)),0x20);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x34);
      auVar41 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13)),auVar87);
      auVar42 = vshufps_avx(auVar41,auVar87,0xd8);
      auVar142._8_8_ = 0;
      auVar142._0_8_ = *(ulong *)(pcVar18 + lVar13 + 0x1c);
      auVar41 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x18)),auVar142);
      auVar178 = vshufps_avx(auVar41,auVar142,0xd8);
      fVar69 = *(float *)(pcVar18 + lVar13 + 0x24);
      fVar122 = *(float *)(pcVar18 + lVar13 + 0x28);
      fVar123 = *(float *)(pcVar18 + lVar13 + 0x2c);
      fVar92 = *(float *)(pcVar18 + lVar13 + 0x30);
      fVar104 = fVar92 * fVar92 + fVar123 * fVar123 + fVar69 * fVar69 + fVar122 * fVar122;
      auVar41 = vrsqrtss_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104));
      fVar105 = auVar41._0_4_;
      fVar104 = fVar105 * 1.5 + fVar105 * fVar105 * fVar105 * fVar104 * -0.5;
      auVar178 = vinsertps_avx(auVar178,ZEXT416((uint)(fVar104 * fVar69)),0x30);
      aVar130 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                vinsertps_avx(auVar42,ZEXT416((uint)(fVar104 * fVar122)),0x30);
      auVar41 = vinsertps_avx(ZEXT416(*(uint *)(pcVar18 + lVar13 + 0xc)),
                              ZEXT416(*(uint *)(pcVar18 + lVar13 + 4)),0x10);
      auVar89 = vinsertps_avx(auVar97,ZEXT416((uint)(fVar104 * fVar92)),0x30);
      auVar97 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(pcVar18 + lVar13 + 0x3c)),0x20);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar97,ZEXT416((uint)(fVar104 * fVar123)),0x30);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar18 = pRVar19->ptr_ofs;
      lVar13 = uVar14 * pRVar19->stride;
      aVar130 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                 ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar18 + lVar13))->v;
      b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar18 + lVar13 + 0x10))->v;
      auVar89 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x20);
      auVar178 = *(undefined1 (*) [16])(pcVar18 + lVar13 + 0x30);
    }
    auVar97 = vshufps_avx(auVar60,auVar60,0xff);
    auVar41 = vshufps_avx(auVar67,auVar67,0xff);
    auVar42 = vshufps_avx(auVar68,auVar68,0xff);
    auVar43 = vshufps_avx(auVar93,auVar93,0xff);
    auVar51 = vshufps_avx(auVar178,auVar178,0xff);
    auVar84 = vshufps_avx((undefined1  [16])aVar130,(undefined1  [16])aVar130,0xff);
    auVar138 = vshufps_avx((undefined1  [16])b0.field_0,(undefined1  [16])b0.field_0,0xff);
    local_238 = vshufps_avx(auVar89,auVar89,0xff);
    fVar122 = auVar41._0_4_;
    fVar123 = auVar97._0_4_;
    fVar104 = auVar42._0_4_;
    fVar92 = auVar43._0_4_;
    fVar69 = fVar92 * local_238._0_4_ +
             fVar104 * auVar138._0_4_ + auVar51._0_4_ * fVar123 + auVar84._0_4_ * fVar122;
    auVar90._0_4_ = -fVar69;
    auVar90._4_4_ = 0x80000000;
    auVar90._8_4_ = 0x80000000;
    auVar90._12_4_ = 0x80000000;
    auVar118._0_8_ = local_238._0_8_ ^ 0x8000000080000000;
    auVar118._8_4_ = local_238._8_4_ ^ 0x80000000;
    auVar118._12_4_ = local_238._12_4_ ^ 0x80000000;
    if (fVar69 < auVar90._0_4_) {
      auVar182._0_8_ = auVar51._0_8_ ^ 0x8000000080000000;
      auVar182._8_4_ = auVar51._8_4_ ^ 0x80000000;
      auVar182._12_4_ = auVar51._12_4_ ^ 0x80000000;
      auVar172._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
      auVar172._8_4_ = auVar84._8_4_ ^ 0x80000000;
      auVar172._12_4_ = auVar84._12_4_ ^ 0x80000000;
      auVar51 = auVar182;
      auVar84 = auVar172;
      local_238 = auVar118;
    }
    auVar102._8_4_ = 0x7fffffff;
    auVar102._0_8_ = 0x7fffffff7fffffff;
    auVar102._12_4_ = 0x7fffffff;
    auVar97 = vandps_avx(ZEXT416((uint)fVar69),auVar102);
    fVar106 = auVar97._0_4_;
    auVar119._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
    auVar119._8_4_ = auVar138._8_4_ ^ 0x80000000;
    auVar119._12_4_ = auVar138._12_4_ ^ 0x80000000;
    auVar41 = vcmpss_avx(ZEXT416((uint)fVar69),auVar90,1);
    auVar42 = vmaxss_avx(auVar90,ZEXT416((uint)fVar69));
    fVar105 = auVar42._0_4_;
    fVar69 = 1.0 - fVar106;
    if (fVar69 < 0.0) {
      local_c8 = auVar41;
      local_b8 = auVar119;
      local_a8 = auVar97;
      fVar69 = sqrtf(fVar69);
      auVar41 = local_c8;
      auVar97 = local_a8;
      auVar119 = local_b8;
    }
    else {
      auVar42 = vsqrtss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
      fVar69 = auVar42._0_4_;
    }
    auVar41 = vblendvps_avx(auVar138,auVar119,auVar41);
    auVar43 = vmaxss_avx(ZEXT816(0) << 0x40,
                         ZEXT416((uint)(1.5707964 -
                                       fVar69 * (fVar106 * (fVar106 * (fVar106 * (fVar106 * (fVar106
                                                                                             * 
                                                  -0.0043095737 + 0.0192803) + -0.04489909) +
                                                  0.08785567) + -0.21450998) + 1.5707952))));
    auVar120._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
    auVar120._8_4_ = auVar43._8_4_ ^ 0x80000000;
    auVar120._12_4_ = auVar43._12_4_ ^ 0x80000000;
    auVar42 = vcmpss_avx(ZEXT416((uint)fVar105),ZEXT816(0) << 0x40,1);
    auVar42 = vblendvps_avx(auVar43,auVar120,auVar42);
    auVar97 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar97,1);
    auVar144._8_4_ = 0x7fc00000;
    auVar144._0_8_ = 0x7fc000007fc00000;
    auVar144._12_4_ = 0x7fc00000;
    auVar97 = vblendvps_avx(ZEXT416((uint)(1.5707964 - auVar42._0_4_)),auVar144,auVar97);
    fVar124 = fVar107 * auVar97._0_4_;
    auVar97 = ZEXT416((uint)(fVar124 * 0.63661975));
    auVar97 = vroundss_avx(auVar97,auVar97,9);
    uVar16 = (uint)auVar97._0_4_;
    fVar124 = fVar124 - auVar97._0_4_ * 1.5707964;
    fVar106 = fVar124 * fVar124;
    uVar20 = uVar16 & 3;
    fVar69 = fVar106 * (fVar106 * (fVar106 * (fVar106 * (fVar106 * -2.5963018e-07 + 2.4756235e-05) +
                                             -0.001388833) + 0.04166664) + -0.5) + 1.0;
    fVar124 = fVar124 * (fVar106 * (fVar106 * (fVar106 * (fVar106 * (fVar106 * -2.5029328e-08 +
                                                                    2.7600126e-06) + -0.00019842605)
                                              + 0.008333348) + -0.16666667) + 1.0);
    fVar106 = fVar69;
    if ((uVar16 & 1) != 0) {
      fVar106 = fVar124;
      fVar124 = fVar69;
    }
    if (uVar20 - 1 < 2) {
      fVar106 = -fVar106;
    }
    fVar162 = fVar123 * fVar105 - auVar51._0_4_;
    fVar165 = fVar122 * fVar105 - auVar84._0_4_;
    fVar166 = fVar105 * fVar104 - auVar41._0_4_;
    fVar167 = fVar105 * fVar92 - (float)local_238._0_4_;
    fVar69 = fVar167 * fVar167 + fVar166 * fVar166 + fVar162 * fVar162 + fVar165 * fVar165;
    auVar97 = vrsqrtss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
    fVar145 = auVar97._0_4_;
    fVar69 = fVar145 * 1.5 + fVar145 * fVar145 * fVar145 * fVar69 * -0.5;
    if (uVar20 < 2) {
      fVar124 = -fVar124;
    }
    fVar159 = 1.0 - fVar107;
    fVar154 = fVar123 * fVar159 + fVar107 * auVar51._0_4_;
    fVar155 = fVar122 * fVar159 + fVar107 * auVar84._0_4_;
    fVar156 = fVar159 * fVar104 + fVar107 * auVar41._0_4_;
    fVar145 = fVar92 * fVar159 + fVar107 * (float)local_238._0_4_;
    fVar153 = fVar145 * fVar145 + fVar156 * fVar156 + fVar154 * fVar154 + fVar155 * fVar155;
    auVar97 = vrsqrtss_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153));
    fVar160 = auVar97._0_4_;
    fVar153 = fVar160 * 1.5 + fVar160 * fVar160 * fVar160 * fVar153 * -0.5;
    if (0.9995 < fVar105) {
      fVar154 = fVar154 * fVar153;
      fVar155 = fVar155 * fVar153;
      fVar156 = fVar156 * fVar153;
    }
    else {
      fVar154 = fVar106 * fVar123 + fVar69 * fVar162 * fVar124;
      fVar155 = fVar106 * fVar122 + fVar69 * fVar165 * fVar124;
      fVar156 = fVar104 * fVar106 + fVar69 * fVar166 * fVar124;
    }
    local_138 = auVar93._0_4_;
    fStack_134 = auVar93._4_4_;
    fStack_130 = auVar93._8_4_;
    fStack_12c = auVar93._12_4_;
    auVar97 = vcmpss_avx(SUB6416(ZEXT464(0x3f7fdf3b),0),ZEXT416((uint)fVar105),1);
    auVar97 = vblendvps_avx(ZEXT416((uint)(fVar92 * fVar106 + fVar69 * fVar167 * fVar124)),
                            ZEXT416((uint)(fVar153 * fVar145)),auVar97);
    auVar41 = vpermilps_avx(ZEXT416((uint)fVar107),0);
    local_118 = aVar130.v[0];
    fStack_114 = aVar130.v[1];
    fStack_110 = aVar130.v[2];
    fStack_10c = aVar130.v[3];
    fVar69 = auVar41._0_4_;
    fVar107 = auVar41._4_4_;
    fVar122 = auVar41._8_4_;
    fVar123 = auVar41._12_4_;
    auVar41 = vshufps_avx(ZEXT416((uint)fVar159),ZEXT416((uint)fVar159),0);
    local_148 = auVar67._0_4_;
    fStack_144 = auVar67._4_4_;
    fStack_140 = auVar67._8_4_;
    fStack_13c = auVar67._12_4_;
    fVar92 = auVar41._0_4_;
    fVar104 = auVar41._4_4_;
    fVar105 = auVar41._8_4_;
    fVar106 = auVar41._12_4_;
    local_258._4_4_ = fVar104 * fStack_144 + fVar107 * fStack_114;
    local_258._0_4_ = fVar92 * local_148 + fVar69 * local_118;
    fStack_250 = fVar105 * fStack_140 + fVar122 * fStack_110;
    fStack_24c = fVar106 * fStack_13c + fVar123 * fStack_10c;
    local_158 = b0.field_0._0_4_;
    fStack_154 = b0.field_0._4_4_;
    fStack_150 = b0.field_0._8_4_;
    fStack_14c = b0.field_0._12_4_;
    local_108 = auVar68._0_4_;
    fStack_104 = auVar68._4_4_;
    fStack_100 = auVar68._8_4_;
    fStack_fc = auVar68._12_4_;
    auVar121._0_4_ = fVar92 * local_108 + fVar69 * local_158;
    auVar121._4_4_ = fVar104 * fStack_104 + fVar107 * fStack_154;
    auVar121._8_4_ = fVar105 * fStack_100 + fVar122 * fStack_150;
    auVar121._12_4_ = fVar106 * fStack_fc + fVar123 * fStack_14c;
    local_168 = auVar89._0_4_;
    fStack_164 = auVar89._4_4_;
    fStack_160 = auVar89._8_4_;
    fStack_15c = auVar89._12_4_;
    auVar103._0_4_ = local_138 * fVar92 + fVar69 * local_168;
    auVar103._4_4_ = fStack_134 * fVar104 + fVar107 * fStack_164;
    auVar103._8_4_ = fStack_130 * fVar105 + fVar122 * fStack_160;
    auVar103._12_4_ = fStack_12c * fVar106 + fVar123 * fStack_15c;
    local_128 = auVar178._0_4_;
    fStack_124 = auVar178._4_4_;
    fStack_120 = auVar178._8_4_;
    fStack_11c = auVar178._12_4_;
    local_f8 = auVar60._0_4_;
    fStack_f4 = auVar60._4_4_;
    fStack_f0 = auVar60._8_4_;
    fStack_ec = auVar60._12_4_;
    auVar91._0_4_ = fVar92 * local_f8 + fVar69 * local_128;
    auVar91._4_4_ = fVar104 * fStack_f4 + fVar107 * fStack_124;
    auVar91._8_4_ = fVar105 * fStack_f0 + fVar122 * fStack_120;
    auVar91._12_4_ = fVar106 * fStack_ec + fVar123 * fStack_11c;
    fVar167 = auVar97._0_4_;
    fVar69 = fVar155 * fVar156 + fVar167 * fVar154;
    fVar123 = fVar155 * fVar156 - fVar167 * fVar154;
    fVar92 = fVar154 * fVar154 - fVar155 * fVar155;
    fVar104 = fVar167 * fVar155 - fVar154 * fVar156;
    fVar107 = fVar167 * fVar155 + fVar154 * fVar156;
    fVar122 = fVar167 * fVar156 + fVar154 * fVar155;
    fVar105 = fVar167 * fVar156 - fVar154 * fVar155;
    auVar67 = ZEXT416((uint)(-fVar167 * fVar167 +
                            -fVar156 * fVar156 + fVar154 * fVar154 + fVar155 * fVar155));
    auVar67 = vshufps_avx(auVar67,auVar67,0);
    auVar68 = ZEXT416((uint)(fVar69 + fVar69));
    auVar68 = vshufps_avx(auVar68,auVar68,0);
    auVar60 = ZEXT416((uint)(fVar104 + fVar104));
    auVar60 = vshufps_avx(auVar60,auVar60,0);
    fVar104 = auVar67._0_4_ * 1.0 + auVar68._0_4_ * 0.0 + auVar60._0_4_ * 0.0;
    fVar106 = auVar67._4_4_ * 0.0 + auVar68._4_4_ * 1.0 + auVar60._4_4_ * 0.0;
    fVar124 = auVar67._8_4_ * 0.0 + auVar68._8_4_ * 0.0 + auVar60._8_4_ * 1.0;
    fVar162 = auVar67._12_4_ * 0.0 + auVar68._12_4_ * 0.0 + auVar60._12_4_ * 0.0;
    auVar67 = ZEXT416((uint)(-fVar167 * fVar167 + fVar156 * fVar156 + fVar92));
    auVar67 = vshufps_avx(auVar67,auVar67,0);
    auVar68 = ZEXT416((uint)(fVar122 + fVar122));
    auVar68 = vshufps_avx(auVar68,auVar68,0);
    auVar60 = ZEXT416((uint)(fVar123 + fVar123));
    auVar60 = vshufps_avx(auVar60,auVar60,0);
    fVar122 = auVar60._0_4_ * 1.0 + auVar68._0_4_ * 0.0 + auVar67._0_4_ * 0.0;
    fVar123 = auVar60._4_4_ * 0.0 + auVar68._4_4_ * 0.0 + auVar67._4_4_ * 1.0;
    fVar165 = auVar60._8_4_ * 0.0 + auVar68._8_4_ * 1.0 + auVar67._8_4_ * 0.0;
    fVar166 = auVar60._12_4_ * 0.0 + auVar68._12_4_ * 0.0 + auVar67._12_4_ * 0.0;
    auVar67 = ZEXT416((uint)(fVar167 * fVar167 + -fVar156 * fVar156 + fVar92));
    auVar68 = vshufps_avx(auVar67,auVar67,0);
    auVar67 = ZEXT416((uint)(fVar105 + fVar105));
    auVar60 = vshufps_avx(auVar67,auVar67,0);
    auVar67 = ZEXT416((uint)(fVar107 + fVar107));
    auVar97 = vshufps_avx(auVar67,auVar67,0);
    auVar67 = vshufps_avx(_local_258,ZEXT416(0) << 0x20,0xe9);
    auVar67 = vblendps_avx(auVar67,auVar121,4);
    fVar107 = auVar97._0_4_ * 1.0 + auVar60._0_4_ * 0.0 + auVar68._0_4_ * 0.0;
    fVar92 = auVar97._4_4_ * 0.0 + auVar60._4_4_ * 1.0 + auVar68._4_4_ * 0.0;
    fVar153 = auVar97._8_4_ * 0.0 + auVar60._8_4_ * 0.0 + auVar68._8_4_ * 1.0;
    fVar154 = auVar97._12_4_ * 0.0 + auVar60._12_4_ * 0.0 + auVar68._12_4_ * 0.0;
    fVar105 = auVar67._0_4_;
    fVar167 = auVar67._4_4_;
    fVar145 = auVar67._8_4_;
    fVar69 = auVar67._12_4_;
    auVar67 = vshufps_avx(_local_258,_local_258,0);
    a0_1.field_0._0_4_ = auVar67._0_4_ * fVar104 + fVar122 * 0.0 + fVar107 * 0.0;
    a0_1.field_0._4_4_ = auVar67._4_4_ * fVar106 + fVar123 * 0.0 + fVar92 * 0.0;
    a0_1.field_0._8_4_ = auVar67._8_4_ * fVar124 + fVar165 * 0.0 + fVar153 * 0.0;
    a0_1.field_0._12_4_ = auVar67._12_4_ * fVar162 + fVar166 * 0.0 + fVar154 * 0.0;
    auVar67 = vshufps_avx(auVar121,auVar121,0);
    auVar68 = vshufps_avx(auVar121,auVar121,0x55);
    aVar130._0_4_ = auVar67._0_4_ * fVar104 + auVar68._0_4_ * fVar122 + fVar107 * 0.0;
    aVar130._4_4_ = auVar67._4_4_ * fVar106 + auVar68._4_4_ * fVar123 + fVar92 * 0.0;
    aVar130._8_4_ = auVar67._8_4_ * fVar124 + auVar68._8_4_ * fVar165 + fVar153 * 0.0;
    aVar130._12_4_ = auVar67._12_4_ * fVar162 + auVar68._12_4_ * fVar166 + fVar154 * 0.0;
    auVar67 = vshufps_avx(auVar103,auVar103,0x55);
    auVar68 = vshufps_avx(auVar103,auVar103,0xaa);
    auVar60 = vshufps_avx(auVar103,auVar103,0);
    auVar93._0_4_ = auVar60._0_4_ * fVar104 + auVar67._0_4_ * fVar122 + fVar107 * auVar68._0_4_;
    auVar93._4_4_ = auVar60._4_4_ * fVar106 + auVar67._4_4_ * fVar123 + fVar92 * auVar68._4_4_;
    auVar93._8_4_ = auVar60._8_4_ * fVar124 + auVar67._8_4_ * fVar165 + fVar153 * auVar68._8_4_;
    auVar93._12_4_ = auVar60._12_4_ * fVar162 + auVar67._12_4_ * fVar166 + fVar154 * auVar68._12_4_;
    auVar67 = vshufps_avx(auVar91,auVar91,0xaa);
    auVar68 = vshufps_avx(auVar91,auVar91,0x55);
    fVar107 = auVar68._0_4_ * fVar122 + fVar107 * auVar67._0_4_;
    fVar122 = auVar68._4_4_ * fVar123 + fVar92 * auVar67._4_4_;
    fVar123 = auVar68._8_4_ * fVar165 + fVar153 * auVar67._8_4_;
    fVar92 = auVar68._12_4_ * fVar166 + fVar154 * auVar67._12_4_;
    auVar68 = vshufps_avx(auVar91,auVar91,0);
  }
  auVar67._0_4_ = fVar105 + 0.0 + auVar68._0_4_ * fVar104 + fVar107;
  auVar67._4_4_ = fVar167 + 0.0 + auVar68._4_4_ * fVar106 + fVar122;
  auVar67._8_4_ = fVar145 + 0.0 + auVar68._8_4_ * fVar124 + fVar123;
  auVar67._12_4_ = fVar69 + 0.0 + auVar68._12_4_ * fVar162 + fVar92;
LAB_010a2638:
  auVar68 = vshufps_avx(auVar93,auVar93,0xc9);
  auVar60 = vshufps_avx((undefined1  [16])aVar130,(undefined1  [16])aVar130,0xc9);
  auVar157._0_4_ = auVar93._0_4_ * auVar60._0_4_;
  auVar157._4_4_ = auVar93._4_4_ * auVar60._4_4_;
  auVar157._8_4_ = auVar93._8_4_ * auVar60._8_4_;
  auVar157._12_4_ = auVar93._12_4_ * auVar60._12_4_;
  auVar163._0_4_ = aVar130.v[0] * auVar68._0_4_;
  auVar163._4_4_ = aVar130.v[1] * auVar68._4_4_;
  auVar163._8_4_ = aVar130.v[2] * auVar68._8_4_;
  auVar163._12_4_ = aVar130.v[3] * auVar68._12_4_;
  auVar178 = vsubps_avx(auVar163,auVar157);
  auVar97 = vshufps_avx(auVar178,auVar178,0xc9);
  auVar41 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
  auVar108._0_4_ = auVar68._0_4_ * a0_1.field_0._0_4_;
  auVar108._4_4_ = auVar68._4_4_ * a0_1.field_0._4_4_;
  auVar108._8_4_ = auVar68._8_4_ * a0_1.field_0._8_4_;
  auVar108._12_4_ = auVar68._12_4_ * a0_1.field_0._12_4_;
  auVar98._0_4_ = auVar41._0_4_ * auVar93._0_4_;
  auVar98._4_4_ = auVar41._4_4_ * auVar93._4_4_;
  auVar98._8_4_ = auVar41._8_4_ * auVar93._8_4_;
  auVar98._12_4_ = auVar41._12_4_ * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar98,auVar108);
  auVar109._0_4_ = auVar41._0_4_ * aVar130.v[0];
  auVar109._4_4_ = auVar41._4_4_ * aVar130.v[1];
  auVar109._8_4_ = auVar41._8_4_ * aVar130.v[2];
  auVar109._12_4_ = auVar41._12_4_ * aVar130.v[3];
  auVar136._0_4_ = a0_1.field_0._0_4_ * auVar60._0_4_;
  auVar136._4_4_ = a0_1.field_0._4_4_ * auVar60._4_4_;
  auVar136._8_4_ = a0_1.field_0._8_4_ * auVar60._8_4_;
  auVar136._12_4_ = a0_1.field_0._12_4_ * auVar60._12_4_;
  auVar60 = vsubps_avx(auVar136,auVar109);
  auVar68 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar41 = vunpcklps_avx(auVar97,auVar68);
  auVar68 = vunpcklps_avx(auVar178,auVar60);
  auVar60 = vinsertps_avx(auVar93,auVar93,0x4a);
  auVar93 = vunpcklps_avx(auVar68,ZEXT416(auVar93._0_4_));
  auVar178 = vunpcklps_avx(auVar41,auVar60);
  auVar68 = vdpps_avx((undefined1  [16])a0_1.field_0,auVar97,0x7f);
  auVar60 = vunpckhps_avx(auVar41,auVar60);
  auVar97 = vshufps_avx(auVar68,auVar68,0);
  auVar68 = vdivps_avx(auVar178,auVar97);
  auVar60 = vdivps_avx(auVar60,auVar97);
  auVar97 = vdivps_avx(auVar93,auVar97);
  auVar41 = vshufps_avx(auVar67,auVar67,0);
  auVar93 = vshufps_avx(auVar67,auVar67,0x55);
  auVar67 = vshufps_avx(auVar67,auVar67,0xaa);
  auVar179._0_4_ =
       auVar41._0_4_ * auVar68._0_4_ + auVar60._0_4_ * auVar93._0_4_ + auVar97._0_4_ * auVar67._0_4_
  ;
  auVar179._4_4_ =
       auVar41._4_4_ * auVar68._4_4_ + auVar60._4_4_ * auVar93._4_4_ + auVar97._4_4_ * auVar67._4_4_
  ;
  auVar179._8_4_ =
       auVar41._8_4_ * auVar68._8_4_ + auVar60._8_4_ * auVar93._8_4_ + auVar97._8_4_ * auVar67._8_4_
  ;
  auVar179._12_4_ =
       auVar41._12_4_ * auVar68._12_4_ +
       auVar60._12_4_ * auVar93._12_4_ + auVar97._12_4_ * auVar67._12_4_;
  auVar158._8_4_ = 0x80000000;
  auVar158._0_8_ = 0x8000000080000000;
  auVar158._12_4_ = 0x80000000;
  uVar21 = 2;
  bVar9 = true;
  local_68 = 0.0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar67 = vdpps_avx(auVar68,auVar60,0x7f);
    auVar99._8_4_ = 0x7fffffff;
    auVar99._0_8_ = 0x7fffffff7fffffff;
    auVar99._12_4_ = 0x7fffffff;
    auVar67 = vandps_avx(auVar67,auVar99);
    if (auVar67._0_4_ <= 1e-05) {
      auVar67 = vdpps_avx(auVar68,auVar97,0x7f);
      auVar67 = vandps_avx(auVar67,auVar99);
      if (auVar67._0_4_ <= 1e-05) {
        auVar67 = vdpps_avx(auVar60,auVar97,0x7f);
        auVar67 = vandps_avx(auVar67,auVar99);
        if (auVar67._0_4_ <= 1e-05) {
          auVar41 = vdpps_avx(auVar68,auVar68,0x7f);
          auVar93 = vdpps_avx(auVar60,auVar60,0x7f);
          fVar69 = auVar41._0_4_;
          auVar67 = vandps_avx(ZEXT416((uint)(fVar69 - auVar93._0_4_)),auVar99);
          if (auVar67._0_4_ <= 1e-05) {
            auVar178 = vdpps_avx(auVar97,auVar97,0x7f);
            auVar67 = vandps_avx(ZEXT416((uint)(fVar69 - auVar178._0_4_)),auVar99);
            if ((auVar67._0_4_ <= 1e-05) &&
               (auVar67 = vandps_avx(ZEXT416((uint)(auVar93._0_4_ - auVar178._0_4_)),auVar99),
               auVar67._0_4_ <= 1e-05)) {
              uVar21 = 1;
              if (fVar69 < 0.0) {
                local_68 = sqrtf(fVar69);
                auVar158._8_4_ = 0x80000000;
                auVar158._0_8_ = 0x8000000080000000;
                auVar158._12_4_ = 0x80000000;
              }
              else {
                auVar67 = vsqrtss_avx(auVar41,auVar41);
                local_68 = auVar67._0_4_;
              }
              bVar9 = false;
            }
          }
        }
      }
    }
  }
  pRVar8 = context->userContext;
  uVar20 = pRVar8->instStackSize;
  auVar78._8_8_ = 0;
  auVar78._0_4_ = prim->primID_;
  auVar78._4_4_ = prim->instID_;
  auVar67 = vshufps_avx(auVar78,auVar78,0xe1);
  uVar5 = vmovlps_avx(auVar67);
  *(undefined8 *)(pRVar8->instID + uVar20) = uVar5;
  *(undefined1 (*) [16])pRVar8->world2inst[uVar20] = auVar68;
  *(undefined1 (*) [16])(pRVar8->world2inst[uVar20] + 4) = auVar60;
  *(undefined1 (*) [16])(pRVar8->world2inst[uVar20] + 8) = auVar97;
  pfVar2 = pRVar8->world2inst[uVar20] + 0xc;
  *pfVar2 = -auVar179._0_4_;
  pfVar2[1] = -auVar179._4_4_;
  pfVar2[2] = -auVar179._8_4_;
  pfVar2[3] = -auVar179._12_4_;
  *(undefined1 (*) [16])pRVar8->inst2world[uVar20] = auVar94;
  *(undefined1 (*) [16])(pRVar8->inst2world[uVar20] + 4) = auVar183;
  *(undefined1 (*) [16])(pRVar8->inst2world[uVar20] + 8) = auVar185;
  *(undefined1 (*) [16])(pRVar8->inst2world[uVar20] + 0xc) = auVar186;
  pRVar8->instStackSize = pRVar8->instStackSize + 1;
  local_dc = query->time;
  fVar69 = (query->p).field_0.field_0.x;
  fVar107 = (query->p).field_0.field_0.y;
  fVar122 = (query->p).field_0.field_0.z;
  auVar110._0_4_ = auVar97._0_4_ * fVar122;
  auVar110._4_4_ = auVar97._4_4_ * fVar122;
  auVar110._8_4_ = auVar97._8_4_ * fVar122;
  auVar110._12_4_ = auVar97._12_4_ * fVar122;
  auVar94 = vsubps_avx(auVar110,auVar179);
  auVar79._0_4_ = auVar68._0_4_ * fVar69 + auVar60._0_4_ * fVar107 + auVar94._0_4_;
  auVar79._4_4_ = auVar68._4_4_ * fVar69 + auVar60._4_4_ * fVar107 + auVar94._4_4_;
  auVar79._8_4_ = auVar68._8_4_ * fVar69 + auVar60._8_4_ * fVar107 + auVar94._8_4_;
  auVar79._12_4_ = auVar68._12_4_ * fVar69 + auVar60._12_4_ * fVar107 + auVar94._12_4_;
  local_e8 = vmovlps_avx(auVar79);
  local_e0 = vextractps_avx(auVar79,2);
  local_d8 = local_68 * query->radius;
  local_88 = context->query_ws;
  local_60 = context->userPtr;
  local_90 = 0;
  local_78._0_8_ = context->func;
  local_78._8_8_ = context->userContext;
  local_58 = 0xffffffffffffffff;
  fVar69 = local_88->radius;
  local_48._4_4_ = fVar69;
  local_48._0_4_ = fVar69;
  local_48._8_4_ = fVar69;
  local_48._12_4_ = fVar69;
  if (bVar9) {
    if (fVar69 < INFINITY) {
      lVar13 = vpextrq_avx(local_78,1);
      if (*(int *)(lVar13 + 0x88) != 0) {
        lVar17 = (ulong)(*(int *)(lVar13 + 0x88) - 1) * 0x40;
        pfVar2 = (float *)(lVar13 + lVar17);
        pfVar3 = (float *)(lVar13 + 0x10 + lVar17);
        pfVar4 = (float *)(lVar13 + 0x20 + lVar17);
        auVar94 = *(undefined1 (*) [16])(lVar13 + 0x30 + lVar17);
        auVar67 = vshufps_avx(local_48,local_48,0);
        fVar156 = (float)((uint)auVar67._0_4_ ^ auVar158._0_4_);
        fVar159 = (float)((uint)auVar67._4_4_ ^ auVar158._4_4_);
        fVar160 = (float)((uint)auVar67._8_4_ ^ auVar158._8_4_);
        fVar161 = (float)((uint)auVar67._12_4_ ^ auVar158._12_4_);
        auVar152._0_4_ = auVar67._0_4_ * *pfVar4;
        auVar152._4_4_ = auVar67._4_4_ * pfVar4[1];
        auVar152._8_4_ = auVar67._8_4_ * pfVar4[2];
        auVar152._12_4_ = auVar67._12_4_ * pfVar4[3];
        auVar60 = vsubps_avx(auVar94,auVar152);
        fVar162 = fVar156 * *pfVar3;
        fVar165 = fVar159 * pfVar3[1];
        fVar166 = fVar160 * pfVar3[2];
        fVar167 = fVar161 * pfVar3[3];
        fVar168 = fVar162 + auVar60._0_4_;
        fVar173 = fVar165 + auVar60._4_4_;
        fVar174 = fVar166 + auVar60._8_4_;
        fVar175 = fVar167 + auVar60._12_4_;
        fVar156 = fVar156 * *pfVar2;
        fVar159 = fVar159 * pfVar2[1];
        fVar160 = fVar160 * pfVar2[2];
        fVar161 = fVar161 * pfVar2[3];
        auVar176._0_4_ = fVar168 + fVar156;
        auVar176._4_4_ = fVar173 + fVar159;
        auVar176._8_4_ = fVar174 + fVar160;
        auVar176._12_4_ = fVar175 + fVar161;
        auVar180._8_4_ = 0x7f800000;
        auVar180._0_8_ = 0x7f8000007f800000;
        auVar180._12_4_ = 0x7f800000;
        auVar68 = vminps_avx(auVar180,auVar176);
        auVar184._8_4_ = 0xff800000;
        auVar184._0_8_ = 0xff800000ff800000;
        auVar184._12_4_ = 0xff800000;
        auVar67 = vmaxps_avx(auVar184,auVar176);
        fVar107 = fVar69 * *pfVar4 + auVar94._0_4_;
        fVar122 = fVar69 * pfVar4[1] + auVar94._4_4_;
        fVar123 = fVar69 * pfVar4[2] + auVar94._8_4_;
        fVar124 = fVar69 * pfVar4[3] + auVar94._12_4_;
        fVar162 = fVar162 + fVar107;
        fVar165 = fVar165 + fVar122;
        fVar166 = fVar166 + fVar123;
        fVar167 = fVar167 + fVar124;
        auVar164._0_4_ = fVar156 + fVar162;
        auVar164._4_4_ = fVar159 + fVar165;
        auVar164._8_4_ = fVar160 + fVar166;
        auVar164._12_4_ = fVar161 + fVar167;
        auVar68 = vminps_avx(auVar68,auVar164);
        auVar94 = vmaxps_avx(auVar67,auVar164);
        fVar92 = fVar69 * *pfVar3;
        fVar104 = fVar69 * pfVar3[1];
        fVar105 = fVar69 * pfVar3[2];
        fVar106 = fVar69 * pfVar3[3];
        fVar145 = fVar92 + auVar60._0_4_;
        fVar153 = fVar104 + auVar60._4_4_;
        fVar154 = fVar105 + auVar60._8_4_;
        fVar155 = fVar106 + auVar60._12_4_;
        auVar177._0_4_ = fVar156 + fVar145;
        auVar177._4_4_ = fVar159 + fVar153;
        auVar177._8_4_ = fVar160 + fVar154;
        auVar177._12_4_ = fVar161 + fVar155;
        auVar67 = vminps_avx(auVar68,auVar177);
        auVar94 = vmaxps_avx(auVar94,auVar177);
        fVar92 = fVar92 + fVar107;
        fVar104 = fVar104 + fVar122;
        fVar105 = fVar105 + fVar123;
        fVar106 = fVar106 + fVar124;
        auVar111._0_4_ = fVar156 + fVar92;
        auVar111._4_4_ = fVar159 + fVar104;
        auVar111._8_4_ = fVar160 + fVar105;
        auVar111._12_4_ = fVar161 + fVar106;
        auVar67 = vminps_avx(auVar67,auVar111);
        auVar94 = vmaxps_avx(auVar94,auVar111);
        fVar107 = fVar69 * *pfVar2;
        fVar122 = fVar69 * pfVar2[1];
        fVar123 = fVar69 * pfVar2[2];
        fVar69 = fVar69 * pfVar2[3];
        auVar80._0_4_ = fVar168 + fVar107;
        auVar80._4_4_ = fVar173 + fVar122;
        auVar80._8_4_ = fVar174 + fVar123;
        auVar80._12_4_ = fVar175 + fVar69;
        auVar67 = vminps_avx(auVar67,auVar80);
        auVar94 = vmaxps_avx(auVar94,auVar80);
        auVar112._0_4_ = fVar107 + fVar162;
        auVar112._4_4_ = fVar122 + fVar165;
        auVar112._8_4_ = fVar123 + fVar166;
        auVar112._12_4_ = fVar69 + fVar167;
        auVar67 = vminps_avx(auVar67,auVar112);
        auVar94 = vmaxps_avx(auVar94,auVar112);
        auVar113._0_4_ = fVar107 + fVar145;
        auVar113._4_4_ = fVar122 + fVar153;
        auVar113._8_4_ = fVar123 + fVar154;
        auVar113._12_4_ = fVar69 + fVar155;
        auVar67 = vminps_avx(auVar67,auVar113);
        auVar94 = vmaxps_avx(auVar94,auVar113);
        auVar36._0_4_ = fVar107 + fVar92;
        auVar36._4_4_ = fVar122 + fVar104;
        auVar36._8_4_ = fVar123 + fVar105;
        auVar36._12_4_ = fVar69 + fVar106;
        auVar67 = vminps_avx(auVar67,auVar36);
        auVar94 = vmaxps_avx(auVar94,auVar36);
        auVar94 = vsubps_avx(auVar94,auVar67);
        local_48._0_4_ = auVar94._0_4_ * 0.5;
        local_48._4_4_ = auVar94._4_4_ * 0.5;
        local_48._8_4_ = auVar94._8_4_ * 0.5;
        local_48._12_4_ = auVar94._12_4_ * 0.5;
      }
    }
  }
  else {
    local_48 = vshufps_avx(ZEXT416((uint)(local_68 * fVar69)),ZEXT416((uint)(local_68 * fVar69)),0);
  }
  local_98 = pAVar11;
  local_80 = uVar21;
  uVar10 = (**(code **)&pAVar11->field_0x88)(&(pAVar11->super_AccelData).field_0x58,&local_e8);
  pRVar8 = context->userContext;
  uVar20 = pRVar8->instStackSize - 1;
  pRVar8->instStackSize = uVar20;
  pRVar8->instID[uVar20] = 0xffffffff;
  pRVar8->instPrimID[pRVar8->instStackSize] = 0xffffffff;
  return (bool)uVar10;
}

Assistant:

bool InstanceArrayIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      const AffineSpace3fa local2world = instance->getLocal2World(prim.primID_, query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, prim.primID_, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }